

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Scene **ppSVar1;
  float *pfVar2;
  Scene **ppSVar3;
  float *pfVar4;
  Scene **ppSVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [12];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  unkbyte9 Var59;
  undefined1 auVar60 [11];
  undefined1 auVar61 [13];
  undefined1 auVar62 [12];
  undefined1 auVar63 [13];
  undefined1 auVar64 [12];
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined6 uVar70;
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [15];
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [13];
  undefined1 auVar94 [15];
  ulong uVar95;
  RTCIntersectArguments *pRVar96;
  ulong uVar97;
  undefined1 auVar98 [8];
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  ulong uVar99;
  RayQueryContext *pRVar100;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  long lVar101;
  undefined4 uVar102;
  undefined8 unaff_RBP;
  RTCIntersectArguments *pRVar104;
  long lVar105;
  long lVar106;
  byte bVar107;
  uint uVar108;
  uint uVar109;
  uint uVar110;
  uint uVar111;
  uint uVar112;
  float fVar113;
  float fVar133;
  float fVar136;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar114;
  float fVar115;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined8 uVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar131;
  short sVar142;
  int iVar143;
  float fVar144;
  undefined1 auVar146 [12];
  int iVar170;
  undefined1 in_XMM1 [16];
  undefined1 auVar148 [16];
  char cVar174;
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar147 [12];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar168;
  undefined1 auVar169 [16];
  char cVar177;
  char cVar210;
  float fVar178;
  float fVar179;
  undefined1 auVar180 [12];
  float fVar211;
  float fVar212;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar189 [16];
  undefined1 auVar181 [12];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  char cVar225;
  float fVar213;
  float fVar214;
  float fVar226;
  float fVar228;
  undefined1 auVar217 [16];
  float fVar227;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar245;
  float fVar246;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar247;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar256;
  undefined1 auVar257 [12];
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar265;
  float fVar271;
  undefined1 auVar270 [16];
  float fVar272;
  undefined1 uVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar283;
  float fVar284;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  undefined1 auVar285 [16];
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar293;
  undefined1 auVar289 [16];
  float fVar292;
  float fVar294;
  float fVar295;
  undefined1 auVar290 [16];
  float fVar296;
  float fVar307;
  float fVar309;
  undefined1 auVar297 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar308;
  float fVar310;
  float fVar311;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar312;
  float fVar313;
  float fVar321;
  float fVar323;
  undefined1 auVar314 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar322;
  float fVar324;
  float fVar325;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar326;
  float fVar327;
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar334;
  float fVar336;
  float fVar338;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar339;
  float fVar340;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar341 [16];
  float fVar349;
  undefined1 auVar344 [16];
  float fVar350;
  undefined1 local_458;
  undefined1 uStack_457;
  undefined1 uStack_456;
  undefined1 uStack_455;
  float local_448;
  int local_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3e8;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  long local_3a0;
  undefined1 local_398 [16];
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  RTCIntersectArguments *local_348;
  Precalculations *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  RTCFilterFunctionNArguments args;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  undefined8 local_2b8;
  float local_2b0;
  float local_2ac;
  float local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  uint local_29c;
  uint local_298;
  RayQueryContext *local_280;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  Primitive *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  ulong uVar103;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined2 uVar132;
  undefined1 auVar145 [12];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  int iVar171;
  int iVar172;
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar187 [16];
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined1 auVar188 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar215 [12];
  undefined1 auVar218 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  
  PVar17 = prim[1];
  uVar95 = (ulong)(byte)PVar17;
  lVar106 = uVar95 * 0x25;
  uVar102 = *(undefined4 *)(prim + uVar95 * 4 + 6);
  uVar18 = *(undefined4 *)(prim + uVar95 * 5 + 6);
  uVar19 = *(undefined4 *)(prim + uVar95 * 6 + 6);
  uVar20 = *(undefined4 *)(prim + uVar95 * 0xf + 6);
  uVar21 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar22 = *(undefined4 *)(prim + uVar95 * 0x11 + 6);
  uVar23 = *(undefined4 *)(prim + uVar95 * 0x1a + 6);
  uVar24 = *(undefined4 *)(prim + uVar95 * 0x1b + 6);
  pPVar8 = prim + lVar106 + 6;
  fVar293 = *(float *)(pPVar8 + 0xc);
  fVar113 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar293;
  fVar133 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar293;
  fVar136 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar293;
  fVar287 = fVar293 * (ray->dir).field_0.m128[0];
  fVar291 = fVar293 * (ray->dir).field_0.m128[1];
  fVar293 = fVar293 * (ray->dir).field_0.m128[2];
  uVar25 = *(undefined4 *)(prim + uVar95 * 0x1c + 6);
  auVar28[0xd] = 0;
  auVar28._0_13_ = in_XMM1._0_13_;
  auVar28[0xe] = in_XMM1[7];
  auVar32[0xc] = in_XMM1[6];
  auVar32._0_12_ = in_XMM1._0_12_;
  auVar32._13_2_ = auVar28._13_2_;
  auVar36[0xb] = 0;
  auVar36._0_11_ = in_XMM1._0_11_;
  auVar36._12_3_ = auVar32._12_3_;
  auVar40[10] = in_XMM1[5];
  auVar40._0_10_ = in_XMM1._0_10_;
  auVar40._11_4_ = auVar36._11_4_;
  auVar44[9] = 0;
  auVar44._0_9_ = in_XMM1._0_9_;
  auVar44._10_5_ = auVar40._10_5_;
  auVar48[8] = in_XMM1[4];
  auVar48._0_8_ = in_XMM1._0_8_;
  auVar48._9_6_ = auVar44._9_6_;
  Var59 = CONCAT81(CONCAT71(auVar48._8_7_,(char)((uint)uVar18 >> 0x18)),in_XMM1[3]);
  auVar60._2_9_ = Var59;
  auVar60[1] = (char)((uint)uVar18 >> 0x10);
  auVar60[0] = in_XMM1[2];
  cVar210 = (char)((uint)uVar18 >> 8);
  auVar61._2_11_ = auVar60;
  auVar61[1] = cVar210;
  auVar61[0] = in_XMM1[1];
  cVar177 = (char)uVar18;
  sVar142 = CONCAT11(cVar177,in_XMM1[0]);
  auVar55._2_13_ = auVar61;
  auVar55._0_2_ = sVar142;
  uVar132 = (undefined2)Var59;
  auVar150._0_12_ = auVar55._0_12_;
  auVar150._12_2_ = uVar132;
  auVar150._14_2_ = uVar132;
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._0_10_ = auVar55._0_10_;
  auVar149._10_2_ = auVar60._0_2_;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._0_8_ = auVar55._0_8_;
  auVar148._8_2_ = auVar60._0_2_;
  auVar62._4_8_ = auVar148._8_8_;
  auVar62._2_2_ = auVar61._0_2_;
  auVar62._0_2_ = auVar61._0_2_;
  iVar143 = (int)sVar142 >> 8;
  iVar170 = auVar62._0_4_ >> 0x18;
  auVar145._0_8_ = CONCAT44(iVar170,iVar143);
  auVar145._8_4_ = auVar148._8_4_ >> 0x18;
  auVar151._12_4_ = auVar149._12_4_ >> 0x18;
  auVar151._0_12_ = auVar145;
  fVar266 = (float)iVar170;
  cVar174 = cVar210 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar151._0_13_;
  auVar29[0xe] = cVar174;
  auVar33[0xc] = cVar174;
  auVar33._0_12_ = auVar145;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar145._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar174;
  auVar41._0_10_ = auVar145._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar145._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar210;
  auVar49._0_8_ = auVar145._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var59 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar177 >> 7);
  auVar52._6_9_ = Var59;
  auVar52[5] = (char)((uint)uVar19 >> 0x10);
  auVar52[4] = (undefined1)((short)cVar177 >> 7);
  auVar52._0_4_ = iVar143;
  cVar225 = (char)((uint)uVar19 >> 8);
  auVar63._2_11_ = auVar52._4_11_;
  auVar63[1] = cVar225;
  auVar63[0] = (undefined1)((short)cVar177 >> 7);
  cVar210 = (char)uVar19;
  auVar56._2_13_ = auVar63;
  auVar56._0_2_ = CONCAT11(cVar210,cVar177);
  uVar132 = (undefined2)Var59;
  auVar154._0_12_ = auVar56._0_12_;
  auVar154._12_2_ = uVar132;
  auVar154._14_2_ = uVar132;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_10_ = auVar56._0_10_;
  auVar153._10_2_ = auVar52._4_2_;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._0_8_ = auVar56._0_8_;
  auVar152._8_2_ = auVar52._4_2_;
  auVar64._4_8_ = auVar152._8_8_;
  auVar64._2_2_ = auVar63._0_2_;
  auVar64._0_2_ = auVar63._0_2_;
  iVar170 = (int)CONCAT11(cVar210,cVar177) >> 8;
  iVar171 = auVar64._0_4_ >> 0x18;
  auVar146._0_8_ = CONCAT44(iVar171,iVar170);
  auVar146._8_4_ = auVar152._8_4_ >> 0x18;
  auVar155._12_4_ = auVar153._12_4_ >> 0x18;
  auVar155._0_12_ = auVar146;
  fVar286 = (float)iVar171;
  cVar174 = cVar225 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar155._0_13_;
  auVar30[0xe] = cVar174;
  auVar34[0xc] = cVar174;
  auVar34._0_12_ = auVar146;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar146._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar174;
  auVar42._0_10_ = auVar146._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar146._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar225;
  auVar50._0_8_ = auVar146._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var59 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar210 >> 7);
  auVar53._6_9_ = Var59;
  auVar53[5] = (char)((uint)uVar21 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar210 >> 7);
  auVar53._0_4_ = iVar170;
  cVar225 = (char)((uint)uVar21 >> 8);
  auVar65._2_11_ = auVar53._4_11_;
  auVar65[1] = cVar225;
  auVar65[0] = (undefined1)((short)cVar210 >> 7);
  cVar177 = (char)uVar21;
  auVar57._2_13_ = auVar65;
  auVar57._0_2_ = CONCAT11(cVar177,cVar210);
  uVar132 = (undefined2)Var59;
  auVar158._0_12_ = auVar57._0_12_;
  auVar158._12_2_ = uVar132;
  auVar158._14_2_ = uVar132;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar57._0_10_;
  auVar157._10_2_ = auVar53._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar57._0_8_;
  auVar156._8_2_ = auVar53._4_2_;
  auVar66._4_8_ = auVar156._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar171 = (int)CONCAT11(cVar177,cVar210) >> 8;
  iVar172 = auVar66._0_4_ >> 0x18;
  auVar147._0_8_ = CONCAT44(iVar172,iVar171);
  auVar147._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar147;
  fVar271 = (float)iVar172;
  cVar174 = cVar225 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar159._0_13_;
  auVar31[0xe] = cVar174;
  auVar35[0xc] = cVar174;
  auVar35._0_12_ = auVar147;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar147._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar174;
  auVar43._0_10_ = auVar147._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar147._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar225;
  auVar51._0_8_ = auVar147._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var59 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar177 >> 7);
  auVar54._6_9_ = Var59;
  auVar54[5] = (char)((uint)uVar22 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar177 >> 7);
  auVar54._0_4_ = iVar171;
  auVar67._2_11_ = auVar54._4_11_;
  auVar67[1] = (char)((uint)uVar22 >> 8);
  auVar67[0] = (undefined1)((short)cVar177 >> 7);
  sVar142 = CONCAT11((char)uVar22,cVar177);
  auVar58._2_13_ = auVar67;
  auVar58._0_2_ = sVar142;
  uVar132 = (undefined2)Var59;
  auVar162._0_12_ = auVar58._0_12_;
  auVar162._12_2_ = uVar132;
  auVar162._14_2_ = uVar132;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar58._0_10_;
  auVar161._10_2_ = auVar54._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar58._0_8_;
  auVar160._8_2_ = auVar54._4_2_;
  auVar68._4_8_ = auVar160._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  fVar280 = (float)((int)sVar142 >> 8);
  fVar283 = (float)(auVar68._0_4_ >> 0x18);
  fVar284 = (float)(auVar160._8_4_ >> 0x18);
  fVar213 = fVar293 * fVar280;
  fVar226 = fVar293 * fVar283;
  auVar215._0_8_ = CONCAT44(fVar226,fVar213);
  auVar215._8_4_ = fVar293 * fVar284;
  auVar216._12_4_ = fVar293 * (float)(auVar161._12_4_ >> 0x18);
  auVar216._0_12_ = auVar215;
  fVar178 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar106 + 0x16)) *
            *(float *)(prim + lVar106 + 0x1a);
  local_458 = (undefined1)uVar102;
  uStack_457 = (undefined1)((uint)uVar102 >> 8);
  uStack_456 = (undefined1)((uint)uVar102 >> 0x10);
  uStack_455 = (undefined1)((uint)uVar102 >> 0x18);
  auVar82[0xd] = 0;
  auVar82._0_13_ = auVar216._0_13_;
  auVar82[0xe] = (char)((uint)fVar226 >> 0x18);
  auVar87[0xc] = (char)((uint)fVar226 >> 0x10);
  auVar87._0_12_ = auVar215;
  auVar87._13_2_ = auVar82._13_2_;
  auVar88[0xb] = 0;
  auVar88._0_11_ = auVar215._0_11_;
  auVar88._12_3_ = auVar87._12_3_;
  auVar89[10] = (char)((uint)fVar226 >> 8);
  auVar89._0_10_ = auVar215._0_10_;
  auVar89._11_4_ = auVar88._11_4_;
  auVar90[9] = 0;
  auVar90._0_9_ = auVar215._0_9_;
  auVar90._10_5_ = auVar89._10_5_;
  auVar91[8] = SUB41(fVar226,0);
  auVar91._0_8_ = auVar215._0_8_;
  auVar91._9_6_ = auVar90._9_6_;
  Var59 = CONCAT81(CONCAT71(auVar91._8_7_,uStack_455),(char)((uint)fVar213 >> 0x18));
  auVar92._6_9_ = Var59;
  auVar92[5] = uStack_456;
  auVar92[4] = (char)((uint)fVar213 >> 0x10);
  auVar92._0_4_ = fVar213;
  auVar93._2_11_ = auVar92._4_11_;
  auVar93[1] = uStack_457;
  auVar93[0] = (char)((uint)fVar213 >> 8);
  sVar142 = CONCAT11(local_458,SUB41(fVar213,0));
  auVar94._2_13_ = auVar93;
  auVar94._0_2_ = sVar142;
  uVar132 = (undefined2)Var59;
  auVar219._0_12_ = auVar94._0_12_;
  auVar219._12_2_ = uVar132;
  auVar219._14_2_ = uVar132;
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._0_10_ = auVar94._0_10_;
  auVar218._10_2_ = auVar92._4_2_;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._0_8_ = auVar94._0_8_;
  auVar217._8_2_ = auVar92._4_2_;
  auVar69._4_8_ = auVar217._8_8_;
  auVar69._2_2_ = auVar93._0_2_;
  auVar69._0_2_ = auVar93._0_2_;
  fVar214 = (float)((int)sVar142 >> 8);
  fVar227 = (float)(auVar69._0_4_ >> 0x18);
  fVar228 = (float)(auVar217._8_4_ >> 0x18);
  uVar277 = (undefined1)((uint)uVar20 >> 0x18);
  uVar132 = CONCAT11(uVar277,uVar277);
  uVar277 = (undefined1)((uint)uVar20 >> 0x10);
  uVar139 = CONCAT35(CONCAT21(uVar132,uVar277),CONCAT14(uVar277,uVar20));
  uVar277 = (undefined1)((uint)uVar20 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar139 >> 0x20),uVar277),uVar277);
  sVar142 = CONCAT11((char)uVar20,(char)uVar20);
  uVar103 = CONCAT62(uVar70,sVar142);
  auVar316._8_4_ = 0;
  auVar316._0_8_ = uVar103;
  auVar316._12_2_ = uVar132;
  auVar316._14_2_ = uVar132;
  uVar132 = (undefined2)((ulong)uVar139 >> 0x20);
  auVar315._12_4_ = auVar316._12_4_;
  auVar315._8_2_ = 0;
  auVar315._0_8_ = uVar103;
  auVar315._10_2_ = uVar132;
  auVar314._10_6_ = auVar315._10_6_;
  auVar314._8_2_ = uVar132;
  auVar314._0_8_ = uVar103;
  uVar132 = (undefined2)uVar70;
  auVar71._4_8_ = auVar314._8_8_;
  auVar71._2_2_ = uVar132;
  auVar71._0_2_ = uVar132;
  fVar312 = (float)((int)sVar142 >> 8);
  fVar321 = (float)(auVar71._0_4_ >> 0x18);
  fVar323 = (float)(auVar314._8_4_ >> 0x18);
  uVar277 = (undefined1)((uint)uVar23 >> 0x18);
  uVar132 = CONCAT11(uVar277,uVar277);
  uVar277 = (undefined1)((uint)uVar23 >> 0x10);
  uVar139 = CONCAT35(CONCAT21(uVar132,uVar277),CONCAT14(uVar277,uVar23));
  uVar277 = (undefined1)((uint)uVar23 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar139 >> 0x20),uVar277),uVar277);
  sVar142 = CONCAT11((char)uVar23,(char)uVar23);
  uVar103 = CONCAT62(uVar70,sVar142);
  auVar275._8_4_ = 0;
  auVar275._0_8_ = uVar103;
  auVar275._12_2_ = uVar132;
  auVar275._14_2_ = uVar132;
  uVar132 = (undefined2)((ulong)uVar139 >> 0x20);
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._8_2_ = 0;
  auVar274._0_8_ = uVar103;
  auVar274._10_2_ = uVar132;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._8_2_ = uVar132;
  auVar273._0_8_ = uVar103;
  uVar132 = (undefined2)uVar70;
  auVar72._4_8_ = auVar273._8_8_;
  auVar72._2_2_ = uVar132;
  auVar72._0_2_ = uVar132;
  fVar272 = (float)((int)sVar142 >> 8);
  fVar278 = (float)(auVar72._0_4_ >> 0x18);
  fVar279 = (float)(auVar273._8_4_ >> 0x18);
  uVar277 = (undefined1)((uint)uVar24 >> 0x18);
  uVar132 = CONCAT11(uVar277,uVar277);
  uVar277 = (undefined1)((uint)uVar24 >> 0x10);
  uVar139 = CONCAT35(CONCAT21(uVar132,uVar277),CONCAT14(uVar277,uVar24));
  uVar277 = (undefined1)((uint)uVar24 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar139 >> 0x20),uVar277),uVar277);
  sVar142 = CONCAT11((char)uVar24,(char)uVar24);
  uVar103 = CONCAT62(uVar70,sVar142);
  auVar299._8_4_ = 0;
  auVar299._0_8_ = uVar103;
  auVar299._12_2_ = uVar132;
  auVar299._14_2_ = uVar132;
  uVar132 = (undefined2)((ulong)uVar139 >> 0x20);
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._8_2_ = 0;
  auVar298._0_8_ = uVar103;
  auVar298._10_2_ = uVar132;
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._8_2_ = uVar132;
  auVar297._0_8_ = uVar103;
  uVar132 = (undefined2)uVar70;
  auVar73._4_8_ = auVar297._8_8_;
  auVar73._2_2_ = uVar132;
  auVar73._0_2_ = uVar132;
  fVar296 = (float)((int)sVar142 >> 8);
  fVar307 = (float)(auVar73._0_4_ >> 0x18);
  fVar309 = (float)(auVar297._8_4_ >> 0x18);
  uVar277 = (undefined1)((uint)uVar25 >> 0x18);
  uVar132 = CONCAT11(uVar277,uVar277);
  uVar277 = (undefined1)((uint)uVar25 >> 0x10);
  uVar139 = CONCAT35(CONCAT21(uVar132,uVar277),CONCAT14(uVar277,uVar25));
  uVar277 = (undefined1)((uint)uVar25 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar139 >> 0x20),uVar277),uVar277);
  sVar142 = CONCAT11((char)uVar25,(char)uVar25);
  uVar103 = CONCAT62(uVar70,sVar142);
  auVar343._8_4_ = 0;
  auVar343._0_8_ = uVar103;
  auVar343._12_2_ = uVar132;
  auVar343._14_2_ = uVar132;
  uVar132 = (undefined2)((ulong)uVar139 >> 0x20);
  auVar342._12_4_ = auVar343._12_4_;
  auVar342._8_2_ = 0;
  auVar342._0_8_ = uVar103;
  auVar342._10_2_ = uVar132;
  auVar341._10_6_ = auVar342._10_6_;
  auVar341._8_2_ = uVar132;
  auVar341._0_8_ = uVar103;
  uVar132 = (undefined2)uVar70;
  auVar74._4_8_ = auVar341._8_8_;
  auVar74._2_2_ = uVar132;
  auVar74._0_2_ = uVar132;
  fVar179 = (float)((int)sVar142 >> 8);
  fVar211 = (float)(auVar74._0_4_ >> 0x18);
  fVar212 = (float)(auVar341._8_4_ >> 0x18);
  fVar339 = fVar287 * fVar214 + fVar291 * (float)iVar143 + fVar293 * (float)iVar170;
  fVar345 = fVar287 * fVar227 + fVar291 * fVar266 + fVar293 * fVar286;
  fVar347 = fVar287 * fVar228 + fVar291 * (float)auVar145._8_4_ + fVar293 * (float)auVar146._8_4_;
  fVar349 = fVar287 * (float)(auVar218._12_4_ >> 0x18) +
            fVar291 * (float)auVar151._12_4_ + fVar293 * (float)auVar155._12_4_;
  fVar326 = fVar287 * fVar312 + fVar291 * (float)iVar171 + fVar213;
  fVar333 = fVar287 * fVar321 + fVar291 * fVar271 + fVar226;
  fVar335 = fVar287 * fVar323 + fVar291 * (float)auVar147._8_4_ + auVar215._8_4_;
  fVar337 = fVar287 * (float)(auVar315._12_4_ >> 0x18) +
            fVar291 * (float)auVar159._12_4_ + auVar216._12_4_;
  fVar213 = fVar287 * fVar272 + fVar291 * fVar296 + fVar293 * fVar179;
  fVar254 = fVar287 * fVar278 + fVar291 * fVar307 + fVar293 * fVar211;
  fVar255 = fVar287 * fVar279 + fVar291 * fVar309 + fVar293 * fVar212;
  fVar287 = fVar287 * (float)(auVar274._12_4_ >> 0x18) +
            fVar291 * (float)(auVar298._12_4_ >> 0x18) + fVar293 * (float)(auVar342._12_4_ >> 0x18);
  uVar139 = *(undefined8 *)(prim + uVar95 * 7 + 6);
  uVar10 = *(undefined8 *)(prim + uVar95 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar95 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar95 * 0xd + 6);
  uVar103 = *(ulong *)(prim + uVar95 * 0x12 + 6);
  local_3d8 = fVar214 * fVar113 + (float)iVar143 * fVar133 + (float)iVar170 * fVar136;
  fStack_3d4 = fVar227 * fVar113 + fVar266 * fVar133 + fVar286 * fVar136;
  fStack_3d0 = fVar228 * fVar113 + (float)auVar145._8_4_ * fVar133 + (float)auVar146._8_4_ * fVar136
  ;
  fStack_3cc = (float)(auVar218._12_4_ >> 0x18) * fVar113 +
               (float)auVar151._12_4_ * fVar133 + (float)auVar155._12_4_ * fVar136;
  fVar280 = fVar312 * fVar113 + (float)iVar171 * fVar133 + fVar280 * fVar136;
  fVar283 = fVar321 * fVar113 + fVar271 * fVar133 + fVar283 * fVar136;
  fVar284 = fVar323 * fVar113 + (float)auVar147._8_4_ * fVar133 + fVar284 * fVar136;
  fVar286 = (float)(auVar315._12_4_ >> 0x18) * fVar113 +
            (float)auVar159._12_4_ * fVar133 + (float)(auVar161._12_4_ >> 0x18) * fVar136;
  fVar214 = fVar113 * fVar272 + fVar133 * fVar296 + fVar136 * fVar179;
  fVar226 = fVar113 * fVar278 + fVar133 * fVar307 + fVar136 * fVar211;
  fVar227 = fVar113 * fVar279 + fVar133 * fVar309 + fVar136 * fVar212;
  fVar228 = fVar113 * (float)(auVar274._12_4_ >> 0x18) +
            fVar133 * (float)(auVar298._12_4_ >> 0x18) + fVar136 * (float)(auVar342._12_4_ >> 0x18);
  fVar293 = (float)DAT_01f4bd50;
  fVar113 = DAT_01f4bd50._4_4_;
  fVar133 = DAT_01f4bd50._8_4_;
  fVar136 = DAT_01f4bd50._12_4_;
  uVar108 = -(uint)(fVar293 <= ABS(fVar339));
  uVar109 = -(uint)(fVar113 <= ABS(fVar345));
  uVar110 = -(uint)(fVar133 <= ABS(fVar347));
  uVar111 = -(uint)(fVar136 <= ABS(fVar349));
  auVar344._0_4_ = (uint)fVar339 & uVar108;
  auVar344._4_4_ = (uint)fVar345 & uVar109;
  auVar344._8_4_ = (uint)fVar347 & uVar110;
  auVar344._12_4_ = (uint)fVar349 & uVar111;
  auVar182._0_4_ = ~uVar108 & (uint)fVar293;
  auVar182._4_4_ = ~uVar109 & (uint)fVar113;
  auVar182._8_4_ = ~uVar110 & (uint)fVar133;
  auVar182._12_4_ = ~uVar111 & (uint)fVar136;
  auVar182 = auVar182 | auVar344;
  uVar108 = -(uint)(fVar293 <= ABS(fVar326));
  uVar109 = -(uint)(fVar113 <= ABS(fVar333));
  uVar110 = -(uint)(fVar133 <= ABS(fVar335));
  uVar111 = -(uint)(fVar136 <= ABS(fVar337));
  auVar328._0_4_ = (uint)fVar326 & uVar108;
  auVar328._4_4_ = (uint)fVar333 & uVar109;
  auVar328._8_4_ = (uint)fVar335 & uVar110;
  auVar328._12_4_ = (uint)fVar337 & uVar111;
  auVar258._0_4_ = ~uVar108 & (uint)fVar293;
  auVar258._4_4_ = ~uVar109 & (uint)fVar113;
  auVar258._8_4_ = ~uVar110 & (uint)fVar133;
  auVar258._12_4_ = ~uVar111 & (uint)fVar136;
  auVar258 = auVar258 | auVar328;
  uVar108 = -(uint)(fVar293 <= ABS(fVar213));
  uVar109 = -(uint)(fVar113 <= ABS(fVar254));
  uVar110 = -(uint)(fVar133 <= ABS(fVar255));
  uVar111 = -(uint)(fVar136 <= ABS(fVar287));
  auVar248._0_4_ = (uint)fVar213 & uVar108;
  auVar248._4_4_ = (uint)fVar254 & uVar109;
  auVar248._8_4_ = (uint)fVar255 & uVar110;
  auVar248._12_4_ = (uint)fVar287 & uVar111;
  auVar329._0_4_ = ~uVar108 & (uint)fVar293;
  auVar329._4_4_ = ~uVar109 & (uint)fVar113;
  auVar329._8_4_ = ~uVar110 & (uint)fVar133;
  auVar329._12_4_ = ~uVar111 & (uint)fVar136;
  auVar329 = auVar329 | auVar248;
  auVar229 = rcpps(_DAT_01f4bd50,auVar182);
  auVar230._0_4_ = auVar229._0_4_;
  auVar183._0_4_ = auVar182._0_4_ * auVar230._0_4_;
  fStack_404 = auVar229._4_4_;
  auVar183._4_4_ = auVar182._4_4_ * fStack_404;
  fStack_400 = auVar229._8_4_;
  auVar183._8_4_ = auVar182._8_4_ * fStack_400;
  fStack_3fc = auVar229._12_4_;
  auVar183._12_4_ = auVar182._12_4_ * fStack_3fc;
  local_408 = (1.0 - auVar183._0_4_) * auVar230._0_4_ + auVar230._0_4_;
  fStack_404 = (1.0 - auVar183._4_4_) * fStack_404 + fStack_404;
  fStack_400 = (1.0 - auVar183._8_4_) * fStack_400 + fStack_400;
  fStack_3fc = (1.0 - auVar183._12_4_) * fStack_3fc + fStack_3fc;
  auVar184 = rcpps(auVar183,auVar258);
  fVar254 = auVar184._0_4_;
  auVar259._0_4_ = auVar258._0_4_ * fVar254;
  fVar255 = auVar184._4_4_;
  fVar293 = auVar258._4_4_ * fVar255;
  auVar257._0_8_ = CONCAT44(fVar293,auVar259._0_4_);
  fVar271 = auVar184._8_4_;
  auVar257._8_4_ = auVar258._8_4_ * fVar271;
  fVar272 = auVar184._12_4_;
  fVar254 = (1.0 - auVar259._0_4_) * fVar254 + fVar254;
  fVar255 = (1.0 - fVar293) * fVar255 + fVar255;
  fVar271 = (1.0 - auVar257._8_4_) * fVar271 + fVar271;
  fVar272 = (1.0 - auVar258._12_4_ * fVar272) * fVar272 + fVar272;
  auVar184 = rcpps(auVar184,auVar329);
  auVar185._0_4_ = auVar184._0_4_;
  fStack_3f4 = auVar184._4_4_;
  fStack_3f0 = auVar184._8_4_;
  fStack_3ec = auVar184._12_4_;
  uVar13 = *(undefined8 *)(prim + uVar95 * 0x16 + 6);
  local_3f8 = (1.0 - auVar329._0_4_ * auVar185._0_4_) * auVar185._0_4_ + auVar185._0_4_;
  fStack_3f4 = (1.0 - auVar329._4_4_ * fStack_3f4) * fStack_3f4 + fStack_3f4;
  fStack_3f0 = (1.0 - auVar329._8_4_ * fStack_3f0) * fStack_3f0 + fStack_3f0;
  fStack_3ec = (1.0 - auVar329._12_4_ * fStack_3ec) * fStack_3ec + fStack_3ec;
  auVar188._0_12_ = auVar184._0_12_;
  auVar188._12_2_ = auVar184._6_2_;
  auVar188._14_2_ = (short)((ulong)uVar139 >> 0x30);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._0_10_ = auVar184._0_10_;
  auVar187._10_2_ = (short)((ulong)uVar139 >> 0x20);
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._0_8_ = auVar184._0_8_;
  auVar186._8_2_ = auVar184._4_2_;
  auVar185._8_8_ = auVar186._8_8_;
  auVar185._6_2_ = (short)((ulong)uVar139 >> 0x10);
  auVar185._4_2_ = auVar184._2_2_;
  auVar189._0_4_ = (float)(int)(short)uVar139;
  fVar287 = (float)(auVar185._4_4_ >> 0x10);
  auVar180._0_8_ = CONCAT44(fVar287,auVar189._0_4_);
  auVar180._8_4_ = (float)(auVar186._8_4_ >> 0x10);
  auVar233._0_12_ = auVar229._0_12_;
  auVar233._12_2_ = auVar229._6_2_;
  auVar233._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._0_10_ = auVar229._0_10_;
  auVar232._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._0_8_ = auVar229._0_8_;
  auVar231._8_2_ = auVar229._4_2_;
  auVar230._8_8_ = auVar231._8_8_;
  auVar230._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar230._4_2_ = auVar229._2_2_;
  auVar192._12_2_ = (short)((uint)fVar287 >> 0x10);
  auVar192._0_12_ = auVar180;
  auVar192._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._0_10_ = auVar180._0_10_;
  auVar191._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = SUB42(fVar287,0);
  auVar190._0_8_ = auVar180._0_8_;
  auVar189._8_8_ = auVar190._8_8_;
  auVar189._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar189._4_2_ = (short)((uint)auVar189._0_4_ >> 0x10);
  auVar193._0_4_ = (float)(int)(short)uVar11;
  fVar266 = (float)(auVar189._4_4_ >> 0x10);
  auVar181._0_8_ = CONCAT44(fVar266,auVar193._0_4_);
  auVar181._8_4_ = (float)(auVar190._8_4_ >> 0x10);
  auVar262._12_2_ = (short)((uint)fVar293 >> 0x10);
  auVar262._0_12_ = auVar257;
  auVar262._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._0_10_ = auVar257._0_10_;
  auVar261._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._8_2_ = SUB42(fVar293,0);
  auVar260._0_8_ = auVar257._0_8_;
  auVar259._8_8_ = auVar260._8_8_;
  auVar259._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar259._4_2_ = (short)((uint)auVar259._0_4_ >> 0x10);
  uVar132 = (undefined2)(uVar103 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar103;
  auVar229._12_2_ = uVar132;
  auVar229._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar103 >> 0x20);
  auVar184._12_4_ = auVar229._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar103;
  auVar184._10_2_ = uVar132;
  auVar116._10_6_ = auVar184._10_6_;
  auVar116._8_2_ = uVar132;
  auVar116._0_8_ = uVar103;
  uVar132 = (undefined2)(uVar103 >> 0x10);
  auVar75._4_8_ = auVar116._8_8_;
  auVar75._2_2_ = uVar132;
  auVar75._0_2_ = uVar132;
  fVar293 = (float)(auVar75._0_4_ >> 0x10);
  fVar179 = (float)(auVar116._8_4_ >> 0x10);
  auVar196._12_2_ = (short)((uint)fVar266 >> 0x10);
  auVar196._0_12_ = auVar181;
  auVar196._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._0_10_ = auVar181._0_10_;
  auVar195._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = SUB42(fVar266,0);
  auVar194._0_8_ = auVar181._0_8_;
  auVar193._8_8_ = auVar194._8_8_;
  auVar193._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar193._4_2_ = (short)((uint)auVar193._0_4_ >> 0x10);
  uVar97 = *(ulong *)(prim + uVar95 * 0x14 + 6);
  uVar132 = (undefined2)(uVar97 >> 0x30);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar97;
  auVar119._12_2_ = uVar132;
  auVar119._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar97 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar97;
  auVar118._10_2_ = uVar132;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar132;
  auVar117._0_8_ = uVar97;
  uVar132 = (undefined2)(uVar97 >> 0x10);
  auVar76._4_8_ = auVar117._8_8_;
  auVar76._2_2_ = uVar132;
  auVar76._0_2_ = uVar132;
  fVar113 = (float)(auVar76._0_4_ >> 0x10);
  fVar211 = (float)(auVar117._8_4_ >> 0x10);
  uVar99 = *(ulong *)(prim + uVar95 * 0x18 + 6);
  uVar132 = (undefined2)(uVar99 >> 0x30);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar99;
  auVar199._12_2_ = uVar132;
  auVar199._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar99 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar99;
  auVar198._10_2_ = uVar132;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar132;
  auVar197._0_8_ = uVar99;
  uVar132 = (undefined2)(uVar99 >> 0x10);
  auVar77._4_8_ = auVar197._8_8_;
  auVar77._2_2_ = uVar132;
  auVar77._0_2_ = uVar132;
  uVar14 = *(ulong *)(prim + uVar95 * 0x1d + 6);
  uVar132 = (undefined2)(uVar14 >> 0x30);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar14;
  auVar122._12_2_ = uVar132;
  auVar122._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar14 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar14;
  auVar121._10_2_ = uVar132;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar132;
  auVar120._0_8_ = uVar14;
  uVar132 = (undefined2)(uVar14 >> 0x10);
  auVar78._4_8_ = auVar120._8_8_;
  auVar78._2_2_ = uVar132;
  auVar78._0_2_ = uVar132;
  fVar133 = (float)(auVar78._0_4_ >> 0x10);
  fVar212 = (float)(auVar120._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar95 * 0x21 + 6);
  uVar132 = (undefined2)(uVar15 >> 0x30);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar15;
  auVar202._12_2_ = uVar132;
  auVar202._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar15 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar15;
  auVar201._10_2_ = uVar132;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar132;
  auVar200._0_8_ = uVar15;
  uVar132 = (undefined2)(uVar15 >> 0x10);
  auVar79._4_8_ = auVar200._8_8_;
  auVar79._2_2_ = uVar132;
  auVar79._0_2_ = uVar132;
  uVar16 = *(ulong *)(prim + uVar95 * 0x1f + 6);
  uVar132 = (undefined2)(uVar16 >> 0x30);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar16;
  auVar125._12_2_ = uVar132;
  auVar125._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar16 >> 0x20);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar16;
  auVar124._10_2_ = uVar132;
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._8_2_ = uVar132;
  auVar123._0_8_ = uVar16;
  uVar132 = (undefined2)(uVar16 >> 0x10);
  auVar80._4_8_ = auVar123._8_8_;
  auVar80._2_2_ = uVar132;
  auVar80._0_2_ = uVar132;
  fVar136 = (float)(auVar80._0_4_ >> 0x10);
  fVar213 = (float)(auVar123._8_4_ >> 0x10);
  uVar95 = *(ulong *)(prim + uVar95 * 0x23 + 6);
  uVar132 = (undefined2)(uVar95 >> 0x30);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar95;
  auVar205._12_2_ = uVar132;
  auVar205._14_2_ = uVar132;
  uVar132 = (undefined2)(uVar95 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar95;
  auVar204._10_2_ = uVar132;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar132;
  auVar203._0_8_ = uVar95;
  uVar132 = (undefined2)(uVar95 >> 0x10);
  auVar81._4_8_ = auVar203._8_8_;
  auVar81._2_2_ = uVar132;
  auVar81._0_2_ = uVar132;
  auVar234._0_8_ =
       CONCAT44(((((float)(auVar230._4_4_ >> 0x10) - fVar287) * fVar178 + fVar287) - fStack_3d4) *
                fStack_404,
                ((((float)(int)(short)uVar10 - auVar189._0_4_) * fVar178 + auVar189._0_4_) -
                local_3d8) * local_408);
  auVar234._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - auVar180._8_4_) * fVar178 + auVar180._8_4_) - fStack_3d0
       ) * fStack_400;
  auVar234._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar187._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar187._12_4_ >> 0x10)) - fStack_3cc) * fStack_3fc;
  local_3e8._0_4_ =
       ((((float)(int)(short)uVar12 - auVar193._0_4_) * fVar178 + auVar193._0_4_) - local_3d8) *
       local_408;
  local_3e8._4_4_ =
       ((((float)(auVar259._4_4_ >> 0x10) - fVar266) * fVar178 + fVar266) - fStack_3d4) * fStack_404
  ;
  local_3e8._8_4_ =
       ((((float)(auVar260._8_4_ >> 0x10) - auVar181._8_4_) * fVar178 + auVar181._8_4_) - fStack_3d0
       ) * fStack_400;
  local_3e8._12_4_ =
       ((((float)(auVar261._12_4_ >> 0x10) - (float)(auVar191._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar191._12_4_ >> 0x10)) - fStack_3cc) * fStack_3fc;
  auVar281._0_8_ =
       CONCAT44(((((float)(auVar193._4_4_ >> 0x10) - fVar293) * fVar178 + fVar293) - fVar283) *
                fVar255,((((float)(int)(short)uVar13 - (float)(int)(short)uVar103) * fVar178 +
                         (float)(int)(short)uVar103) - fVar280) * fVar254);
  auVar281._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar179) * fVar178 + fVar179) - fVar284) * fVar271;
  auVar281._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar184._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar184._12_4_ >> 0x10)) - fVar286) * fVar272;
  auVar285._0_4_ =
       ((((float)(int)(short)uVar99 - (float)(int)(short)uVar97) * fVar178 +
        (float)(int)(short)uVar97) - fVar280) * fVar254;
  auVar285._4_4_ =
       ((((float)(auVar77._0_4_ >> 0x10) - fVar113) * fVar178 + fVar113) - fVar283) * fVar255;
  auVar285._8_4_ =
       ((((float)(auVar197._8_4_ >> 0x10) - fVar211) * fVar178 + fVar211) - fVar284) * fVar271;
  auVar285._12_4_ =
       ((((float)(auVar198._12_4_ >> 0x10) - (float)(auVar118._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar118._12_4_ >> 0x10)) - fVar286) * fVar272;
  auVar289._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar133) * fVar178 + fVar133) - fVar226) *
                fStack_3f4,
                ((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar178 +
                 (float)(int)(short)uVar14) - fVar214) * local_3f8);
  auVar289._8_4_ =
       ((((float)(auVar200._8_4_ >> 0x10) - fVar212) * fVar178 + fVar212) - fVar227) * fStack_3f0;
  auVar289._12_4_ =
       ((((float)(auVar201._12_4_ >> 0x10) - (float)(auVar121._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar121._12_4_ >> 0x10)) - fVar228) * fStack_3ec;
  auVar300._0_4_ =
       ((((float)(int)(short)uVar95 - (float)(int)(short)uVar16) * fVar178 +
        (float)(int)(short)uVar16) - fVar214) * local_3f8;
  auVar300._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar136) * fVar178 + fVar136) - fVar226) * fStack_3f4;
  auVar300._8_4_ =
       ((((float)(auVar203._8_4_ >> 0x10) - fVar213) * fVar178 + fVar213) - fVar227) * fStack_3f0;
  auVar300._12_4_ =
       ((((float)(auVar204._12_4_ >> 0x10) - (float)(auVar124._12_4_ >> 0x10)) * fVar178 +
        (float)(auVar124._12_4_ >> 0x10)) - fVar228) * fStack_3ec;
  auVar206._8_4_ = auVar234._8_4_;
  auVar206._0_8_ = auVar234._0_8_;
  auVar206._12_4_ = auVar234._12_4_;
  auVar229 = minps(auVar206,(undefined1  [16])local_3e8);
  auVar126._8_4_ = auVar281._8_4_;
  auVar126._0_8_ = auVar281._0_8_;
  auVar126._12_4_ = auVar281._12_4_;
  auVar184 = minps(auVar126,auVar285);
  auVar229 = maxps(auVar229,auVar184);
  auVar127._8_4_ = auVar289._8_4_;
  auVar127._0_8_ = auVar289._0_8_;
  auVar127._12_4_ = auVar289._12_4_;
  auVar184 = minps(auVar127,auVar300);
  uVar102 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar163._4_4_ = uVar102;
  auVar163._0_4_ = uVar102;
  auVar163._8_4_ = uVar102;
  auVar163._12_4_ = uVar102;
  auVar184 = maxps(auVar184,auVar163);
  auVar184 = maxps(auVar229,auVar184);
  fVar113 = auVar184._0_4_ * 0.99999964;
  fVar133 = auVar184._4_4_ * 0.99999964;
  fVar136 = auVar184._8_4_ * 0.99999964;
  fVar179 = auVar184._12_4_ * 0.99999964;
  auVar184 = maxps(auVar234,(undefined1  [16])local_3e8);
  auVar229 = maxps(auVar281,auVar285);
  auVar184 = minps(auVar184,auVar229);
  auVar229 = maxps(auVar289,auVar300);
  fVar293 = ray->tfar;
  auVar128._4_4_ = fVar293;
  auVar128._0_4_ = fVar293;
  auVar128._8_4_ = fVar293;
  auVar128._12_4_ = fVar293;
  auVar229 = minps(auVar229,auVar128);
  auVar184 = minps(auVar184,auVar229);
  auVar164._0_4_ = -(uint)(PVar17 != (Primitive)0x0 && fVar113 <= auVar184._0_4_ * 1.0000004);
  auVar164._4_4_ = -(uint)(1 < (byte)PVar17 && fVar133 <= auVar184._4_4_ * 1.0000004);
  auVar164._8_4_ = -(uint)(2 < (byte)PVar17 && fVar136 <= auVar184._8_4_ * 1.0000004);
  auVar164._12_4_ = -(uint)(3 < (byte)PVar17 && fVar179 <= auVar184._12_4_ * 1.0000004);
  uVar102 = movmskps((int)unaff_RBP,auVar164);
  local_338 = mm_lookupmask_ps._0_8_;
  uStack_330 = mm_lookupmask_ps._8_8_;
  local_340 = pre;
  local_180 = prim;
  for (uVar103 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar102); uVar103 != 0;
      uVar103 = (ulong)((uint)uVar103 & (uint)uVar103 + 0xf & uVar108)) {
    lVar106 = 0;
    if (uVar103 != 0) {
      for (; (uVar103 >> lVar106 & 1) == 0; lVar106 = lVar106 + 1) {
      }
    }
    local_348 = (RTCIntersectArguments *)(ulong)*(uint *)(local_180 + 2);
    local_280 = (RayQueryContext *)(ulong)*(uint *)(local_180 + lVar106 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[(long)local_348].ptr;
    uVar97 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                             (long)local_280 *
                             pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar293 = pGVar26->fnumTimeSegments;
    fVar211 = (pGVar26->time_range).lower;
    fVar212 = (((ray->dir).field_0.m128[3] - fVar211) / ((pGVar26->time_range).upper - fVar211)) *
              fVar293;
    fVar211 = floorf(fVar212);
    fVar293 = fVar293 + -1.0;
    if (fVar293 <= fVar211) {
      fVar211 = fVar293;
    }
    fVar293 = 0.0;
    if (0.0 <= fVar211) {
      fVar293 = fVar211;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar105 = (long)(int)fVar293 * 0x38;
    lVar106 = *(long *)(_Var27 + lVar105);
    lVar101 = *(long *)(_Var27 + 0x10 + lVar105);
    pRVar100 = *(RayQueryContext **)(_Var27 + 0x38 + lVar105);
    lVar105 = *(long *)(_Var27 + 0x48 + lVar105);
    pRVar96 = (RTCIntersectArguments *)(lVar101 * (uVar97 + 3));
    ppSVar1 = (Scene **)((long)&pRVar100->scene + uVar97 * lVar105);
    pfVar2 = (float *)(lVar106 + lVar101 * uVar97);
    ppSVar3 = (Scene **)((long)&pRVar100->scene + (uVar97 + 1) * lVar105);
    pfVar4 = (float *)(lVar106 + lVar101 * (uVar97 + 1));
    ppSVar5 = (Scene **)((long)&pRVar100->scene + (uVar97 + 2) * lVar105);
    pfVar6 = (float *)(lVar106 + lVar101 * (uVar97 + 2));
    fVar212 = fVar212 - fVar293;
    fVar293 = 1.0 - fVar212;
    local_238 = *pfVar2 * fVar293 + *(float *)ppSVar1 * fVar212;
    fStack_234 = pfVar2[1] * fVar293 + *(float *)((long)ppSVar1 + 4) * fVar212;
    fStack_230 = pfVar2[2] * fVar293 + *(float *)(ppSVar1 + 1) * fVar212;
    fStack_22c = pfVar2[3] * fVar293 + *(float *)((long)ppSVar1 + 0xc) * fVar212;
    local_248 = *pfVar4 * fVar293 + *(float *)ppSVar3 * fVar212;
    fStack_244 = pfVar4[1] * fVar293 + *(float *)((long)ppSVar3 + 4) * fVar212;
    fStack_240 = pfVar4[2] * fVar293 + *(float *)(ppSVar3 + 1) * fVar212;
    fStack_23c = pfVar4[3] * fVar293 + *(float *)((long)ppSVar3 + 0xc) * fVar212;
    local_258 = *pfVar6 * fVar293 + *(float *)ppSVar5 * fVar212;
    fStack_254 = pfVar6[1] * fVar293 + *(float *)((long)ppSVar5 + 4) * fVar212;
    fStack_250 = pfVar6[2] * fVar293 + *(float *)(ppSVar5 + 1) * fVar212;
    fStack_24c = pfVar6[3] * fVar293 + *(float *)((long)ppSVar5 + 0xc) * fVar212;
    ppSVar1 = (Scene **)((long)&pRVar100->scene + lVar105 * (uVar97 + 3));
    pfVar2 = (float *)((long)&pRVar96->flags + lVar106);
    local_268 = fVar293 * *pfVar2 + fVar212 * *(float *)ppSVar1;
    fStack_264 = fVar293 * pfVar2[1] + fVar212 * *(float *)((long)ppSVar1 + 4);
    fStack_260 = fVar293 * pfVar2[2] + fVar212 * *(float *)(ppSVar1 + 1);
    fStack_25c = fVar293 * pfVar2[3] + fVar212 * *(float *)((long)ppSVar1 + 0xc);
    fVar293 = (ray->org).field_0.m128[0];
    fVar211 = (ray->org).field_0.m128[1];
    fVar212 = (ray->org).field_0.m128[2];
    local_1f8 = (ray->org).field_0.m128[3];
    fVar278 = local_238 - fVar293;
    fVar279 = fStack_234 - fVar211;
    fVar280 = fStack_230 - fVar212;
    fVar213 = (local_340->ray_space).vx.field_0.m128[0];
    fVar214 = (local_340->ray_space).vx.field_0.m128[1];
    fVar226 = (local_340->ray_space).vx.field_0.m128[2];
    fVar227 = (local_340->ray_space).vx.field_0.m128[3];
    fVar228 = (local_340->ray_space).vy.field_0.m128[0];
    fVar178 = (local_340->ray_space).vy.field_0.m128[1];
    fVar254 = (local_340->ray_space).vy.field_0.m128[2];
    fVar255 = (local_340->ray_space).vy.field_0.m128[3];
    fVar287 = (local_340->ray_space).vz.field_0.m128[0];
    fVar266 = (local_340->ray_space).vz.field_0.m128[1];
    fVar271 = (local_340->ray_space).vz.field_0.m128[2];
    fVar272 = (local_340->ray_space).vz.field_0.m128[3];
    local_218 = fVar278 * fVar213 + fVar279 * fVar228 + fVar280 * fVar287;
    local_198 = fVar278 * fVar214 + fVar279 * fVar178 + fVar280 * fVar266;
    fVar284 = fVar278 * fVar226 + fVar279 * fVar254 + fVar280 * fVar271;
    fVar278 = local_248 - fVar293;
    fVar279 = fStack_244 - fVar211;
    fVar280 = fStack_240 - fVar212;
    local_208 = fVar278 * fVar213 + fVar279 * fVar228 + fVar280 * fVar287;
    local_328 = fVar278 * fVar214 + fVar279 * fVar178 + fVar280 * fVar266;
    fVar286 = fVar278 * fVar226 + fVar279 * fVar254 + fVar280 * fVar271;
    fVar279 = local_258 - fVar293;
    fVar280 = fStack_254 - fVar211;
    fVar283 = fStack_250 - fVar212;
    local_3c8 = fVar279 * fVar213 + fVar280 * fVar228 + fVar283 * fVar287;
    local_1a8 = fVar279 * fVar214 + fVar280 * fVar178 + fVar283 * fVar266;
    fVar278 = fVar279 * fVar226 + fVar280 * fVar254 + fVar283 * fVar271;
    fStack_37c = fVar279 * fVar227 + fVar280 * fVar255 + fVar283 * fVar272;
    fVar293 = local_268 - fVar293;
    fVar211 = fStack_264 - fVar211;
    fVar212 = fStack_260 - fVar212;
    iVar143 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar228 = fVar293 * fVar213 + fVar211 * fVar228 + fVar212 * fVar287;
    fVar214 = fVar293 * fVar214 + fVar211 * fVar178 + fVar212 * fVar266;
    fVar213 = fVar293 * fVar226 + fVar211 * fVar254 + fVar212 * fVar271;
    fStack_34c = fVar293 * fVar227 + fVar211 * fVar255 + fVar212 * fVar272;
    auVar301._0_8_ = CONCAT44(local_198,local_218) & 0x7fffffff7fffffff;
    auVar301._8_4_ = ABS(fVar284);
    auVar301._12_4_ = ABS(fStack_22c);
    auVar220._0_8_ = CONCAT44(local_328,local_208) & 0x7fffffff7fffffff;
    auVar220._8_4_ = ABS(fVar286);
    auVar220._12_4_ = ABS(fStack_23c);
    auVar229 = maxps(auVar301,auVar220);
    auVar235._0_8_ = CONCAT44(local_1a8,local_3c8) & 0x7fffffff7fffffff;
    auVar235._8_4_ = ABS(fVar278);
    auVar235._12_4_ = ABS(fStack_24c);
    auVar165._0_8_ = CONCAT44(fVar214,fVar228) & 0x7fffffff7fffffff;
    auVar165._8_4_ = ABS(fVar213);
    auVar165._12_4_ = ABS(fStack_25c);
    auVar184 = maxps(auVar235,auVar165);
    auVar184 = maxps(auVar229,auVar184);
    local_278._4_4_ = auVar184._4_4_;
    uVar139 = auVar184._8_8_;
    fVar293 = (float)local_278._4_4_;
    if ((float)local_278._4_4_ <= auVar184._0_4_) {
      fVar293 = auVar184._0_4_;
    }
    auVar302._8_8_ = uVar139;
    auVar302._0_8_ = uVar139;
    if (auVar184._8_4_ <= fVar293) {
      auVar303._4_12_ = auVar302._4_12_;
      auVar303._0_4_ = fVar293;
      uVar139 = auVar303._0_8_;
    }
    local_278._0_4_ = (undefined4)iVar143;
    fStack_270 = (float)local_278._4_4_;
    fStack_26c = (float)local_278._4_4_;
    local_398._4_4_ = -(uint)(1.0 < (float)local_278._0_4_);
    local_398._0_4_ = -(uint)(0.0 < (float)local_278._0_4_);
    local_398._8_4_ = -(uint)(2.0 < (float)local_278._0_4_);
    local_398._12_4_ = -(uint)(3.0 < (float)local_278._0_4_);
    lVar106 = (long)iVar143;
    lVar101 = lVar106 * 0x44;
    fVar293 = *(float *)(catmullrom_basis0 + lVar101 + 0xd8c);
    fVar211 = *(float *)(catmullrom_basis0 + lVar101 + 0xd90);
    fVar212 = *(float *)(catmullrom_basis0 + lVar101 + 0xd94);
    fVar226 = *(float *)(catmullrom_basis0 + lVar101 + 0xd98);
    local_3b8 = *(float *)(catmullrom_basis0 + lVar101 + 0x908);
    fStack_3b4 = *(float *)(catmullrom_basis0 + lVar101 + 0x90c);
    fStack_3b0 = *(float *)(catmullrom_basis0 + lVar101 + 0x910);
    fStack_3ac = *(float *)(catmullrom_basis0 + lVar101 + 0x914);
    fVar227 = *(float *)(catmullrom_basis0 + lVar101 + 0x484);
    fVar178 = *(float *)(catmullrom_basis0 + lVar101 + 0x488);
    fVar254 = *(float *)(catmullrom_basis0 + lVar101 + 0x48c);
    fVar255 = *(float *)(catmullrom_basis0 + lVar101 + 0x490);
    fVar287 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar101);
    fVar266 = *(float *)(catmullrom_basis0 + lVar101 + 4);
    fVar271 = *(float *)(catmullrom_basis0 + lVar101 + 8);
    auVar62 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar101);
    fVar272 = *(float *)(catmullrom_basis0 + lVar101 + 0xc);
    local_1c8 = local_218 * fVar287 +
                local_208 * fVar227 + local_3c8 * local_3b8 + fVar228 * fVar293;
    fStack_1c4 = local_218 * fVar266 +
                 local_208 * fVar178 + local_3c8 * fStack_3b4 + fVar228 * fVar211;
    fStack_1c0 = local_218 * fVar271 +
                 local_208 * fVar254 + local_3c8 * fStack_3b0 + fVar228 * fVar212;
    fStack_1bc = local_218 * fVar272 +
                 local_208 * fVar255 + local_3c8 * fStack_3ac + fVar228 * fVar226;
    local_1b8 = local_198 * fVar287 +
                local_328 * fVar227 + local_1a8 * local_3b8 + fVar214 * fVar293;
    fStack_1b4 = local_198 * fVar266 +
                 local_328 * fVar178 + local_1a8 * fStack_3b4 + fVar214 * fVar211;
    fStack_1b0 = local_198 * fVar271 +
                 local_328 * fVar254 + local_1a8 * fStack_3b0 + fVar214 * fVar212;
    fStack_1ac = local_198 * fVar272 +
                 local_328 * fVar255 + local_1a8 * fStack_3ac + fVar214 * fVar226;
    local_378._0_4_ =
         fStack_22c * fVar287 + fStack_23c * fVar227 + fStack_24c * local_3b8 + fStack_25c * fVar293
    ;
    local_378._4_4_ =
         fStack_22c * fVar266 +
         fStack_23c * fVar178 + fStack_24c * fStack_3b4 + fStack_25c * fVar211;
    fStack_370 = fStack_22c * fVar271 +
                 fStack_23c * fVar254 + fStack_24c * fStack_3b0 + fStack_25c * fVar212;
    fStack_36c = fStack_22c * fVar272 +
                 fStack_23c * fVar255 + fStack_24c * fStack_3ac + fStack_25c * fVar226;
    fVar287 = *(float *)(catmullrom_basis1 + lVar101 + 0xd8c);
    fVar266 = *(float *)(catmullrom_basis1 + lVar101 + 0xd90);
    fVar271 = *(float *)(catmullrom_basis1 + lVar101 + 0xd94);
    fVar279 = *(float *)(catmullrom_basis1 + lVar101 + 0xd98);
    fVar280 = *(float *)(catmullrom_basis1 + lVar101 + 0x908);
    fVar283 = *(float *)(catmullrom_basis1 + lVar101 + 0x90c);
    fVar291 = *(float *)(catmullrom_basis1 + lVar101 + 0x910);
    fVar296 = *(float *)(catmullrom_basis1 + lVar101 + 0x914);
    fVar307 = *(float *)(catmullrom_basis1 + lVar101 + 0x484);
    fVar309 = *(float *)(catmullrom_basis1 + lVar101 + 0x488);
    fVar312 = *(float *)(catmullrom_basis1 + lVar101 + 0x48c);
    fVar321 = *(float *)(catmullrom_basis1 + lVar101 + 0x490);
    fVar323 = *(float *)(catmullrom_basis1 + lVar101);
    fVar326 = *(float *)(catmullrom_basis1 + lVar101 + 4);
    fVar333 = *(float *)(catmullrom_basis1 + lVar101 + 8);
    fVar335 = *(float *)(catmullrom_basis1 + lVar101 + 0xc);
    local_228._0_4_ =
         local_218 * fVar323 + local_208 * fVar307 + local_3c8 * fVar280 + fVar228 * fVar287;
    local_228._4_4_ =
         local_218 * fVar326 + local_208 * fVar309 + local_3c8 * fVar283 + fVar228 * fVar266;
    fStack_220 = local_218 * fVar333 + local_208 * fVar312 + local_3c8 * fVar291 + fVar228 * fVar271
    ;
    fStack_21c = local_218 * fVar335 + local_208 * fVar321 + local_3c8 * fVar296 + fVar228 * fVar279
    ;
    local_368 = local_198 * fVar323 + local_328 * fVar307 + local_1a8 * fVar280 + fVar214 * fVar287;
    fStack_364 = local_198 * fVar326 + local_328 * fVar309 + local_1a8 * fVar283 + fVar214 * fVar266
    ;
    fStack_360 = local_198 * fVar333 + local_328 * fVar312 + local_1a8 * fVar291 + fVar214 * fVar271
    ;
    fStack_35c = local_198 * fVar335 + local_328 * fVar321 + local_1a8 * fVar296 + fVar214 * fVar279
    ;
    auVar270._0_4_ =
         fStack_22c * fVar323 + fStack_23c * fVar307 + fStack_24c * fVar280 + fStack_25c * fVar287;
    auVar270._4_4_ =
         fStack_22c * fVar326 + fStack_23c * fVar309 + fStack_24c * fVar283 + fStack_25c * fVar266;
    auVar270._8_4_ =
         fStack_22c * fVar333 + fStack_23c * fVar312 + fStack_24c * fVar291 + fStack_25c * fVar271;
    auVar270._12_4_ =
         fStack_22c * fVar335 + fStack_23c * fVar321 + fStack_24c * fVar296 + fStack_25c * fVar279;
    fVar256 = (float)local_228._0_4_ - local_1c8;
    fVar267 = (float)local_228._4_4_ - fStack_1c4;
    fVar268 = fStack_220 - fStack_1c0;
    fVar269 = fStack_21c - fStack_1bc;
    fVar349 = local_368 - local_1b8;
    fVar245 = fStack_364 - fStack_1b4;
    fVar246 = fStack_360 - fStack_1b0;
    fVar247 = fStack_35c - fStack_1ac;
    fVar337 = local_1b8 * fVar256 - local_1c8 * fVar349;
    fVar339 = fStack_1b4 * fVar267 - fStack_1c4 * fVar245;
    fVar345 = fStack_1b0 * fVar268 - fStack_1c0 * fVar246;
    fVar347 = fStack_1ac * fVar269 - fStack_1bc * fVar247;
    auVar184 = maxps(_local_378,auVar270);
    bVar85 = fVar337 * fVar337 <=
             auVar184._0_4_ * auVar184._0_4_ * (fVar256 * fVar256 + fVar349 * fVar349) &&
             0.0 < (float)local_278._0_4_;
    auVar249._0_4_ = -(uint)bVar85;
    bVar86 = fVar339 * fVar339 <=
             auVar184._4_4_ * auVar184._4_4_ * (fVar267 * fVar267 + fVar245 * fVar245) &&
             1.0 < (float)local_278._0_4_;
    auVar249._4_4_ = -(uint)bVar86;
    bVar84 = fVar345 * fVar345 <=
             auVar184._8_4_ * auVar184._8_4_ * (fVar268 * fVar268 + fVar246 * fVar246) &&
             2.0 < (float)local_278._0_4_;
    auVar249._8_4_ = -(uint)bVar84;
    bVar83 = fVar347 * fVar347 <=
             auVar184._12_4_ * auVar184._12_4_ * (fVar269 * fVar269 + fVar247 * fVar247) &&
             3.0 < (float)local_278._0_4_;
    auVar249._12_4_ = -(uint)bVar83;
    local_448 = (float)uVar139;
    local_448 = local_448 * 4.7683716e-07;
    iVar170 = movmskps((int)local_340,auVar249);
    fVar337 = fVar278;
    fVar339 = fVar278;
    fVar345 = fVar213;
    fVar347 = fVar213;
    fStack_3c4 = local_3c8;
    fStack_3c0 = local_3c8;
    fStack_3bc = local_3c8;
    fStack_380 = fVar278;
    fStack_350 = fVar213;
    fStack_324 = local_328;
    fStack_320 = local_328;
    fStack_31c = local_328;
    fStack_214 = local_218;
    fStack_210 = local_218;
    fStack_20c = local_218;
    fStack_204 = local_208;
    fStack_200 = local_208;
    fStack_1fc = local_208;
    fStack_1f4 = local_1f8;
    fStack_1f0 = local_1f8;
    fStack_1ec = local_1f8;
    fStack_1a4 = local_1a8;
    fStack_1a0 = local_1a8;
    fStack_19c = local_1a8;
    fStack_194 = local_198;
    fStack_190 = local_198;
    fStack_18c = local_198;
    local_178 = fStack_22c;
    fStack_174 = fStack_22c;
    fStack_170 = fStack_22c;
    fStack_16c = fStack_22c;
    local_168 = fStack_23c;
    fStack_164 = fStack_23c;
    fStack_160 = fStack_23c;
    fStack_15c = fStack_23c;
    local_158 = fStack_25c;
    fStack_154 = fStack_25c;
    fStack_150 = fStack_25c;
    fStack_14c = fStack_25c;
    local_148 = fStack_24c;
    fStack_144 = fStack_24c;
    fStack_140 = fStack_24c;
    fStack_13c = fStack_24c;
    if (iVar170 == 0) {
      bVar107 = 0;
      local_388 = local_3c8;
      fStack_384 = local_1a8;
      local_358 = fVar228;
      fStack_354 = fVar214;
    }
    else {
      fVar114 = fVar287 * fVar213 + fVar280 * fVar278 + fVar307 * fVar286 + fVar323 * fVar284;
      fVar134 = fVar266 * fVar213 + fVar283 * fVar278 + fVar309 * fVar286 + fVar326 * fVar284;
      fVar137 = fVar271 * fVar213 + fVar291 * fVar278 + fVar312 * fVar286 + fVar333 * fVar284;
      fVar140 = fVar279 * fVar213 + fVar296 * fVar278 + fVar321 * fVar286 + fVar335 * fVar284;
      local_2e8 = auVar62._0_4_;
      fStack_2e4 = auVar62._4_4_;
      fStack_2e0 = auVar62._8_4_;
      fVar115 = fVar293 * fVar213 + local_3b8 * fVar278 + fVar227 * fVar286 + local_2e8 * fVar284;
      fVar135 = fVar211 * fVar213 + fStack_3b4 * fVar278 + fVar178 * fVar286 + fStack_2e4 * fVar284;
      fVar138 = fVar212 * fVar213 + fStack_3b0 * fVar278 + fVar254 * fVar286 + fStack_2e0 * fVar284;
      fVar141 = fVar226 * fVar213 + fStack_3ac * fVar278 + fVar255 * fVar286 + fVar272 * fVar284;
      fVar293 = *(float *)(catmullrom_basis0 + lVar101 + 0x1210);
      fVar211 = *(float *)(catmullrom_basis0 + lVar101 + 0x1214);
      fVar212 = *(float *)(catmullrom_basis0 + lVar101 + 0x1218);
      fVar226 = *(float *)(catmullrom_basis0 + lVar101 + 0x121c);
      fVar227 = *(float *)(catmullrom_basis0 + lVar101 + 0x1694);
      fVar178 = *(float *)(catmullrom_basis0 + lVar101 + 0x1698);
      fVar254 = *(float *)(catmullrom_basis0 + lVar101 + 0x169c);
      fVar255 = *(float *)(catmullrom_basis0 + lVar101 + 0x16a0);
      fVar287 = *(float *)(catmullrom_basis0 + lVar101 + 0x1b18);
      fVar266 = *(float *)(catmullrom_basis0 + lVar101 + 0x1b1c);
      fVar271 = *(float *)(catmullrom_basis0 + lVar101 + 0x1b20);
      fVar272 = *(float *)(catmullrom_basis0 + lVar101 + 0x1b24);
      fVar279 = *(float *)(catmullrom_basis0 + lVar101 + 0x1f9c);
      fVar280 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa0);
      fVar283 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa4);
      fVar291 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa8);
      fVar288 = local_218 * fVar293 + local_208 * fVar227 + local_3c8 * fVar287 + fVar228 * fVar279;
      fVar292 = local_218 * fVar211 + local_208 * fVar178 + local_3c8 * fVar266 + fVar228 * fVar280;
      fVar294 = local_218 * fVar212 + local_208 * fVar254 + local_3c8 * fVar271 + fVar228 * fVar283;
      fVar295 = local_218 * fVar226 + local_208 * fVar255 + local_3c8 * fVar272 + fVar228 * fVar291;
      fVar340 = local_198 * fVar293 + local_328 * fVar227 + local_1a8 * fVar287 + fVar214 * fVar279;
      fVar346 = local_198 * fVar211 + local_328 * fVar178 + local_1a8 * fVar266 + fVar214 * fVar280;
      fVar348 = local_198 * fVar212 + local_328 * fVar254 + local_1a8 * fVar271 + fVar214 * fVar283;
      fVar350 = local_198 * fVar226 + local_328 * fVar255 + local_1a8 * fVar272 + fVar214 * fVar291;
      fVar296 = *(float *)(catmullrom_basis1 + lVar101 + 0x1210);
      fVar307 = *(float *)(catmullrom_basis1 + lVar101 + 0x1214);
      fVar309 = *(float *)(catmullrom_basis1 + lVar101 + 0x1218);
      fVar312 = *(float *)(catmullrom_basis1 + lVar101 + 0x121c);
      fVar321 = *(float *)(catmullrom_basis1 + lVar101 + 0x1b18);
      fVar323 = *(float *)(catmullrom_basis1 + lVar101 + 0x1b1c);
      fVar326 = *(float *)(catmullrom_basis1 + lVar101 + 0x1b20);
      fVar333 = *(float *)(catmullrom_basis1 + lVar101 + 0x1b24);
      fVar335 = *(float *)(catmullrom_basis1 + lVar101 + 0x1f9c);
      fVar308 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa0);
      fVar310 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa4);
      fVar311 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa8);
      auVar236._0_4_ = local_3c8 * fVar321 + fVar228 * fVar335;
      auVar236._4_4_ = local_3c8 * fVar323 + fVar228 * fVar308;
      auVar236._8_4_ = local_3c8 * fVar326 + fVar228 * fVar310;
      auVar236._12_4_ = local_3c8 * fVar333 + fVar228 * fVar311;
      fVar313 = *(float *)(catmullrom_basis1 + lVar101 + 0x1694);
      fVar322 = *(float *)(catmullrom_basis1 + lVar101 + 0x1698);
      fVar324 = *(float *)(catmullrom_basis1 + lVar101 + 0x169c);
      fVar325 = *(float *)(catmullrom_basis1 + lVar101 + 0x16a0);
      fVar327 = local_218 * fVar296 + local_208 * fVar313 + auVar236._0_4_;
      fVar334 = local_218 * fVar307 + local_208 * fVar322 + auVar236._4_4_;
      fVar336 = local_218 * fVar309 + local_208 * fVar324 + auVar236._8_4_;
      fVar338 = local_218 * fVar312 + local_208 * fVar325 + auVar236._12_4_;
      fVar144 = local_198 * fVar296 + local_328 * fVar313 + local_1a8 * fVar321 + fVar214 * fVar335;
      fVar173 = local_198 * fVar307 + local_328 * fVar322 + local_1a8 * fVar323 + fVar214 * fVar308;
      fVar175 = local_198 * fVar309 + local_328 * fVar324 + local_1a8 * fVar326 + fVar214 * fVar310;
      fVar176 = local_198 * fVar312 + local_328 * fVar325 + local_1a8 * fVar333 + fVar214 * fVar311;
      auVar304._0_8_ = CONCAT44(fVar292,fVar288) & 0x7fffffff7fffffff;
      auVar304._8_4_ = ABS(fVar294);
      auVar304._12_4_ = ABS(fVar295);
      auVar276._0_8_ = CONCAT44(fVar346,fVar340) & 0x7fffffff7fffffff;
      auVar276._8_4_ = ABS(fVar348);
      auVar276._12_4_ = ABS(fVar350);
      auVar184 = maxps(auVar304,auVar276);
      auVar317._0_8_ =
           CONCAT44(fVar211 * fVar284 + fVar178 * fVar286 + fVar266 * fVar278 + fVar280 * fVar213,
                    fVar293 * fVar284 + fVar227 * fVar286 + fVar287 * fVar278 + fVar279 * fVar213) &
           0x7fffffff7fffffff;
      auVar317._8_4_ =
           ABS(fVar212 * fVar284 + fVar254 * fVar286 + fVar271 * fVar278 + fVar283 * fVar213);
      auVar317._12_4_ =
           ABS(fVar226 * fVar284 + fVar255 * fVar286 + fVar272 * fVar278 + fVar291 * fVar213);
      auVar184 = maxps(auVar184,auVar317);
      uVar108 = -(uint)(local_448 <= auVar184._0_4_);
      uVar109 = -(uint)(local_448 <= auVar184._4_4_);
      uVar110 = -(uint)(local_448 <= auVar184._8_4_);
      uVar111 = -(uint)(local_448 <= auVar184._12_4_);
      fVar178 = (float)((uint)fVar288 & uVar108 | ~uVar108 & (uint)fVar256);
      fVar255 = (float)((uint)fVar292 & uVar109 | ~uVar109 & (uint)fVar267);
      fVar287 = (float)((uint)fVar294 & uVar110 | ~uVar110 & (uint)fVar268);
      fVar266 = (float)((uint)fVar295 & uVar111 | ~uVar111 & (uint)fVar269);
      fVar271 = (float)(~uVar108 & (uint)fVar349 | (uint)fVar340 & uVar108);
      fVar272 = (float)(~uVar109 & (uint)fVar245 | (uint)fVar346 & uVar109);
      fVar279 = (float)(~uVar110 & (uint)fVar246 | (uint)fVar348 & uVar110);
      fVar280 = (float)(~uVar111 & (uint)fVar247 | (uint)fVar350 & uVar111);
      auVar318._0_8_ = CONCAT44(fVar334,fVar327) & 0x7fffffff7fffffff;
      auVar318._8_4_ = ABS(fVar336);
      auVar318._12_4_ = ABS(fVar338);
      auVar282._0_8_ = CONCAT44(fVar173,fVar144) & 0x7fffffff7fffffff;
      auVar282._8_4_ = ABS(fVar175);
      auVar282._12_4_ = ABS(fVar176);
      auVar184 = maxps(auVar318,auVar282);
      auVar263._0_8_ =
           CONCAT44(fVar307 * fVar284 + fVar322 * fVar286 + fVar323 * fVar278 + fVar308 * fVar213,
                    fVar296 * fVar284 + fVar313 * fVar286 + fVar321 * fVar278 + fVar335 * fVar213) &
           0x7fffffff7fffffff;
      auVar263._8_4_ =
           ABS(fVar309 * fVar284 + fVar324 * fVar286 + fVar326 * fVar278 + fVar310 * fVar213);
      auVar263._12_4_ =
           ABS(fVar312 * fVar284 + fVar325 * fVar286 + fVar333 * fVar278 + fVar311 * fVar213);
      auVar184 = maxps(auVar184,auVar263);
      uVar108 = -(uint)(local_448 <= auVar184._0_4_);
      uVar109 = -(uint)(local_448 <= auVar184._4_4_);
      uVar110 = -(uint)(local_448 <= auVar184._8_4_);
      uVar111 = -(uint)(local_448 <= auVar184._12_4_);
      fVar309 = (float)((uint)fVar327 & uVar108 | ~uVar108 & (uint)fVar256);
      fVar312 = (float)((uint)fVar334 & uVar109 | ~uVar109 & (uint)fVar267);
      fVar256 = (float)((uint)fVar336 & uVar110 | ~uVar110 & (uint)fVar268);
      fVar267 = (float)((uint)fVar338 & uVar111 | ~uVar111 & (uint)fVar269);
      fVar283 = (float)(~uVar108 & (uint)fVar349 | (uint)fVar144 & uVar108);
      fVar291 = (float)(~uVar109 & (uint)fVar245 | (uint)fVar173 & uVar109);
      fVar296 = (float)(~uVar110 & (uint)fVar246 | (uint)fVar175 & uVar110);
      fVar307 = (float)(~uVar111 & (uint)fVar247 | (uint)fVar176 & uVar111);
      auVar166._0_4_ = fVar271 * fVar271 + fVar178 * fVar178;
      auVar166._4_4_ = fVar272 * fVar272 + fVar255 * fVar255;
      auVar166._8_4_ = fVar279 * fVar279 + fVar287 * fVar287;
      auVar166._12_4_ = fVar280 * fVar280 + fVar266 * fVar266;
      auVar184 = rsqrtps(auVar236,auVar166);
      fVar293 = auVar184._0_4_;
      fVar211 = auVar184._4_4_;
      fVar212 = auVar184._8_4_;
      fVar226 = auVar184._12_4_;
      auVar237._0_4_ = fVar293 * fVar293 * auVar166._0_4_ * 0.5 * fVar293;
      auVar237._4_4_ = fVar211 * fVar211 * auVar166._4_4_ * 0.5 * fVar211;
      auVar237._8_4_ = fVar212 * fVar212 * auVar166._8_4_ * 0.5 * fVar212;
      auVar237._12_4_ = fVar226 * fVar226 * auVar166._12_4_ * 0.5 * fVar226;
      fVar321 = fVar293 * 1.5 - auVar237._0_4_;
      fVar323 = fVar211 * 1.5 - auVar237._4_4_;
      fVar326 = fVar212 * 1.5 - auVar237._8_4_;
      fVar333 = fVar226 * 1.5 - auVar237._12_4_;
      auVar167._0_4_ = fVar283 * fVar283 + fVar309 * fVar309;
      auVar167._4_4_ = fVar291 * fVar291 + fVar312 * fVar312;
      auVar167._8_4_ = fVar296 * fVar296 + fVar256 * fVar256;
      auVar167._12_4_ = fVar307 * fVar307 + fVar267 * fVar267;
      auVar184 = rsqrtps(auVar237,auVar167);
      fVar293 = auVar184._0_4_;
      fVar211 = auVar184._4_4_;
      fVar212 = auVar184._8_4_;
      fVar226 = auVar184._12_4_;
      fVar293 = fVar293 * 1.5 - fVar293 * fVar293 * auVar167._0_4_ * 0.5 * fVar293;
      fVar227 = fVar211 * 1.5 - fVar211 * fVar211 * auVar167._4_4_ * 0.5 * fVar211;
      fVar212 = fVar212 * 1.5 - fVar212 * fVar212 * auVar167._8_4_ * 0.5 * fVar212;
      fVar254 = fVar226 * 1.5 - fVar226 * fVar226 * auVar167._12_4_ * 0.5 * fVar226;
      fVar269 = fVar271 * fVar321 * (float)local_378._0_4_;
      fVar308 = fVar272 * fVar323 * (float)local_378._4_4_;
      fVar310 = fVar279 * fVar326 * fStack_370;
      fVar311 = fVar280 * fVar333 * fStack_36c;
      fVar211 = -fVar178 * fVar321 * (float)local_378._0_4_;
      fVar226 = -fVar255 * fVar323 * (float)local_378._4_4_;
      fVar178 = -fVar287 * fVar326 * fStack_370;
      fVar255 = -fVar266 * fVar333 * fStack_36c;
      fVar144 = fVar321 * 0.0 * (float)local_378._0_4_;
      fVar173 = fVar323 * 0.0 * (float)local_378._4_4_;
      fVar175 = fVar326 * 0.0 * fStack_370;
      fVar176 = fVar333 * 0.0 * fStack_36c;
      local_3b8 = fVar115 + fVar144;
      fStack_3b4 = fVar135 + fVar173;
      fStack_3b0 = fVar138 + fVar175;
      fStack_3ac = fVar141 + fVar176;
      fVar313 = fVar283 * fVar293 * auVar270._0_4_;
      fVar322 = fVar291 * fVar227 * auVar270._4_4_;
      fVar324 = fVar296 * fVar212 * auVar270._8_4_;
      fVar325 = fVar307 * fVar254 * auVar270._12_4_;
      fVar321 = (float)local_228._0_4_ + fVar313;
      fVar323 = (float)local_228._4_4_ + fVar322;
      fVar326 = fStack_220 + fVar324;
      fVar333 = fStack_21c + fVar325;
      fVar335 = -fVar309 * fVar293 * auVar270._0_4_;
      fVar349 = -fVar312 * fVar227 * auVar270._4_4_;
      fVar245 = -fVar256 * fVar212 * auVar270._8_4_;
      fVar246 = -fVar267 * fVar254 * auVar270._12_4_;
      fVar287 = local_368 + fVar335;
      fVar266 = fStack_364 + fVar349;
      fVar271 = fStack_360 + fVar245;
      fVar272 = fStack_35c + fVar246;
      fVar280 = fVar293 * 0.0 * auVar270._0_4_;
      fVar291 = fVar227 * 0.0 * auVar270._4_4_;
      fVar307 = fVar212 * 0.0 * auVar270._8_4_;
      fVar312 = fVar254 * 0.0 * auVar270._12_4_;
      fVar293 = local_1c8 - fVar269;
      fVar212 = fStack_1c4 - fVar308;
      fVar227 = fStack_1c0 - fVar310;
      fVar254 = fStack_1bc - fVar311;
      fVar247 = fVar114 + fVar280;
      fVar256 = fVar134 + fVar291;
      fVar267 = fVar137 + fVar307;
      fVar268 = fVar140 + fVar312;
      fVar279 = local_1b8 - fVar211;
      fVar283 = fStack_1b4 - fVar226;
      fVar296 = fStack_1b0 - fVar178;
      fVar309 = fStack_1ac - fVar255;
      fVar115 = fVar115 - fVar144;
      fVar135 = fVar135 - fVar173;
      fVar138 = fVar138 - fVar175;
      fVar141 = fVar141 - fVar176;
      uVar108 = -(uint)(0.0 < (fVar279 * (fVar247 - fVar115) - fVar115 * (fVar287 - fVar279)) * 0.0
                              + (fVar115 * (fVar321 - fVar293) - (fVar247 - fVar115) * fVar293) *
                                0.0 + ((fVar287 - fVar279) * fVar293 - (fVar321 - fVar293) * fVar279
                                      ));
      uVar109 = -(uint)(0.0 < (fVar283 * (fVar256 - fVar135) - fVar135 * (fVar266 - fVar283)) * 0.0
                              + (fVar135 * (fVar323 - fVar212) - (fVar256 - fVar135) * fVar212) *
                                0.0 + ((fVar266 - fVar283) * fVar212 - (fVar323 - fVar212) * fVar283
                                      ));
      uVar110 = -(uint)(0.0 < (fVar296 * (fVar267 - fVar138) - fVar138 * (fVar271 - fVar296)) * 0.0
                              + (fVar138 * (fVar326 - fVar227) - (fVar267 - fVar138) * fVar227) *
                                0.0 + ((fVar271 - fVar296) * fVar227 - (fVar326 - fVar227) * fVar296
                                      ));
      uVar111 = -(uint)(0.0 < (fVar309 * (fVar268 - fVar141) - fVar141 * (fVar272 - fVar309)) * 0.0
                              + (fVar141 * (fVar333 - fVar254) - (fVar268 - fVar141) * fVar254) *
                                0.0 + ((fVar272 - fVar309) * fVar254 - (fVar333 - fVar254) * fVar309
                                      ));
      fVar144 = (float)((uint)((float)local_228._0_4_ - fVar313) & uVar108 |
                       ~uVar108 & (uint)(local_1c8 + fVar269));
      fVar173 = (float)((uint)((float)local_228._4_4_ - fVar322) & uVar109 |
                       ~uVar109 & (uint)(fStack_1c4 + fVar308));
      fVar175 = (float)((uint)(fStack_220 - fVar324) & uVar110 |
                       ~uVar110 & (uint)(fStack_1c0 + fVar310));
      fVar176 = (float)((uint)(fStack_21c - fVar325) & uVar111 |
                       ~uVar111 & (uint)(fStack_1bc + fVar311));
      local_368 = (float)((uint)(local_368 - fVar335) & uVar108 |
                         ~uVar108 & (uint)(local_1b8 + fVar211));
      fStack_364 = (float)((uint)(fStack_364 - fVar349) & uVar109 |
                          ~uVar109 & (uint)(fStack_1b4 + fVar226));
      fStack_360 = (float)((uint)(fStack_360 - fVar245) & uVar110 |
                          ~uVar110 & (uint)(fStack_1b0 + fVar178));
      fStack_35c = (float)((uint)(fStack_35c - fVar246) & uVar111 |
                          ~uVar111 & (uint)(fStack_1ac + fVar255));
      fVar269 = (float)((uint)(fVar114 - fVar280) & uVar108 | ~uVar108 & (uint)local_3b8);
      fVar308 = (float)((uint)(fVar134 - fVar291) & uVar109 | ~uVar109 & (uint)fStack_3b4);
      fVar310 = (float)((uint)(fVar137 - fVar307) & uVar110 | ~uVar110 & (uint)fStack_3b0);
      fVar311 = (float)((uint)(fVar140 - fVar312) & uVar111 | ~uVar111 & (uint)fStack_3ac);
      fVar211 = (float)((uint)fVar293 & uVar108 | ~uVar108 & (uint)fVar321);
      fVar226 = (float)((uint)fVar212 & uVar109 | ~uVar109 & (uint)fVar323);
      fVar178 = (float)((uint)fVar227 & uVar110 | ~uVar110 & (uint)fVar326);
      fVar255 = (float)((uint)fVar254 & uVar111 | ~uVar111 & (uint)fVar333);
      fVar280 = (float)((uint)fVar279 & uVar108 | ~uVar108 & (uint)fVar287);
      fVar291 = (float)((uint)fVar283 & uVar109 | ~uVar109 & (uint)fVar266);
      fVar307 = (float)((uint)fVar296 & uVar110 | ~uVar110 & (uint)fVar271);
      fVar312 = (float)((uint)fVar309 & uVar111 | ~uVar111 & (uint)fVar272);
      fVar313 = (float)((uint)fVar115 & uVar108 | ~uVar108 & (uint)fVar247);
      fVar322 = (float)((uint)fVar135 & uVar109 | ~uVar109 & (uint)fVar256);
      fVar324 = (float)((uint)fVar138 & uVar110 | ~uVar110 & (uint)fVar267);
      fVar325 = (float)((uint)fVar141 & uVar111 | ~uVar111 & (uint)fVar268);
      fVar321 = (float)((uint)fVar321 & uVar108 | ~uVar108 & (uint)fVar293) - fVar144;
      fVar323 = (float)((uint)fVar323 & uVar109 | ~uVar109 & (uint)fVar212) - fVar173;
      fVar326 = (float)((uint)fVar326 & uVar110 | ~uVar110 & (uint)fVar227) - fVar175;
      fVar333 = (float)((uint)fVar333 & uVar111 | ~uVar111 & (uint)fVar254) - fVar176;
      fVar287 = (float)((uint)fVar287 & uVar108 | ~uVar108 & (uint)fVar279) - local_368;
      fVar266 = (float)((uint)fVar266 & uVar109 | ~uVar109 & (uint)fVar283) - fStack_364;
      fVar271 = (float)((uint)fVar271 & uVar110 | ~uVar110 & (uint)fVar296) - fStack_360;
      fVar272 = (float)((uint)fVar272 & uVar111 | ~uVar111 & (uint)fVar309) - fStack_35c;
      fVar335 = (float)((uint)fVar247 & uVar108 | ~uVar108 & (uint)fVar115) - fVar269;
      fVar349 = (float)((uint)fVar256 & uVar109 | ~uVar109 & (uint)fVar135) - fVar308;
      fVar245 = (float)((uint)fVar267 & uVar110 | ~uVar110 & (uint)fVar138) - fVar310;
      fVar246 = (float)((uint)fVar268 & uVar111 | ~uVar111 & (uint)fVar141) - fVar311;
      fVar114 = fVar144 - fVar211;
      fVar115 = fVar173 - fVar226;
      fVar134 = fVar175 - fVar178;
      fVar135 = fVar176 - fVar255;
      fVar279 = local_368 - fVar280;
      fVar283 = fStack_364 - fVar291;
      fVar296 = fStack_360 - fVar307;
      fVar309 = fStack_35c - fVar312;
      fVar293 = fVar269 - fVar313;
      fVar212 = fVar308 - fVar322;
      fVar227 = fVar310 - fVar324;
      fVar254 = fVar311 - fVar325;
      fVar247 = (local_368 * fVar335 - fVar269 * fVar287) * 0.0 +
                (fVar269 * fVar321 - fVar144 * fVar335) * 0.0 +
                (fVar144 * fVar287 - local_368 * fVar321);
      fVar256 = (fStack_364 * fVar349 - fVar308 * fVar266) * 0.0 +
                (fVar308 * fVar323 - fVar173 * fVar349) * 0.0 +
                (fVar173 * fVar266 - fStack_364 * fVar323);
      auVar221._4_4_ = fVar256;
      auVar221._0_4_ = fVar247;
      fVar267 = (fStack_360 * fVar245 - fVar310 * fVar271) * 0.0 +
                (fVar310 * fVar326 - fVar175 * fVar245) * 0.0 +
                (fVar175 * fVar271 - fStack_360 * fVar326);
      fVar268 = (fStack_35c * fVar246 - fVar311 * fVar272) * 0.0 +
                (fVar311 * fVar333 - fVar176 * fVar246) * 0.0 +
                (fVar176 * fVar272 - fStack_35c * fVar333);
      auVar330._0_4_ =
           (fVar280 * fVar293 - fVar313 * fVar279) * 0.0 +
           (fVar313 * fVar114 - fVar211 * fVar293) * 0.0 + (fVar211 * fVar279 - fVar280 * fVar114);
      auVar330._4_4_ =
           (fVar291 * fVar212 - fVar322 * fVar283) * 0.0 +
           (fVar322 * fVar115 - fVar226 * fVar212) * 0.0 + (fVar226 * fVar283 - fVar291 * fVar115);
      auVar330._8_4_ =
           (fVar307 * fVar227 - fVar324 * fVar296) * 0.0 +
           (fVar324 * fVar134 - fVar178 * fVar227) * 0.0 + (fVar178 * fVar296 - fVar307 * fVar134);
      auVar330._12_4_ =
           (fVar312 * fVar254 - fVar325 * fVar309) * 0.0 +
           (fVar325 * fVar135 - fVar255 * fVar254) * 0.0 + (fVar255 * fVar309 - fVar312 * fVar135);
      auVar221._8_4_ = fVar267;
      auVar221._12_4_ = fVar268;
      auVar184 = maxps(auVar221,auVar330);
      bVar85 = auVar184._0_4_ <= 0.0 && bVar85;
      auVar222._0_4_ = -(uint)bVar85;
      bVar86 = auVar184._4_4_ <= 0.0 && bVar86;
      auVar222._4_4_ = -(uint)bVar86;
      bVar84 = auVar184._8_4_ <= 0.0 && bVar84;
      auVar222._8_4_ = -(uint)bVar84;
      bVar83 = auVar184._12_4_ <= 0.0 && bVar83;
      auVar222._12_4_ = -(uint)bVar83;
      iVar170 = movmskps(iVar170,auVar222);
      if (iVar170 == 0) {
LAB_003c6297:
        auVar129._8_8_ = uStack_330;
        auVar129._0_8_ = local_338;
      }
      else {
        fVar211 = ray->tfar;
        auVar238._0_4_ = fVar293 * fVar287;
        auVar238._4_4_ = fVar212 * fVar266;
        auVar238._8_4_ = fVar227 * fVar271;
        auVar238._12_4_ = fVar254 * fVar272;
        fVar280 = fVar279 * fVar335 - auVar238._0_4_;
        fVar291 = fVar283 * fVar349 - auVar238._4_4_;
        fVar307 = fVar296 * fVar245 - auVar238._8_4_;
        fVar312 = fVar309 * fVar246 - auVar238._12_4_;
        fVar293 = fVar293 * fVar321 - fVar335 * fVar114;
        fVar226 = fVar212 * fVar323 - fVar349 * fVar115;
        fVar178 = fVar227 * fVar326 - fVar245 * fVar134;
        fVar255 = fVar254 * fVar333 - fVar246 * fVar135;
        fVar279 = fVar114 * fVar287 - fVar279 * fVar321;
        fVar266 = fVar115 * fVar266 - fVar283 * fVar323;
        fVar271 = fVar134 * fVar271 - fVar296 * fVar326;
        fVar272 = fVar135 * fVar272 - fVar309 * fVar333;
        auVar250._0_4_ = fVar280 * 0.0 + fVar293 * 0.0 + fVar279;
        auVar250._4_4_ = fVar291 * 0.0 + fVar226 * 0.0 + fVar266;
        auVar250._8_4_ = fVar307 * 0.0 + fVar178 * 0.0 + fVar271;
        auVar250._12_4_ = fVar312 * 0.0 + fVar255 * 0.0 + fVar272;
        auVar184 = rcpps(auVar238,auVar250);
        fVar212 = auVar184._0_4_;
        fVar227 = auVar184._4_4_;
        fVar254 = auVar184._8_4_;
        fVar287 = auVar184._12_4_;
        fVar212 = (1.0 - auVar250._0_4_ * fVar212) * fVar212 + fVar212;
        fVar227 = (1.0 - auVar250._4_4_ * fVar227) * fVar227 + fVar227;
        fVar254 = (1.0 - auVar250._8_4_ * fVar254) * fVar254 + fVar254;
        fVar287 = (1.0 - auVar250._12_4_ * fVar287) * fVar287 + fVar287;
        fVar293 = (fVar269 * fVar279 + local_368 * fVar293 + fVar144 * fVar280) * fVar212;
        fVar226 = (fVar308 * fVar266 + fStack_364 * fVar226 + fVar173 * fVar291) * fVar227;
        fVar178 = (fVar310 * fVar271 + fStack_360 * fVar178 + fVar175 * fVar307) * fVar254;
        fVar255 = (fVar311 * fVar272 + fStack_35c * fVar255 + fVar176 * fVar312) * fVar287;
        bVar85 = (local_1f8 <= fVar293 && fVar293 <= fVar211) && bVar85;
        auVar239._0_4_ = -(uint)bVar85;
        bVar86 = (local_1f8 <= fVar226 && fVar226 <= fVar211) && bVar86;
        auVar239._4_4_ = -(uint)bVar86;
        bVar84 = (local_1f8 <= fVar178 && fVar178 <= fVar211) && bVar84;
        auVar239._8_4_ = -(uint)bVar84;
        bVar83 = (local_1f8 <= fVar255 && fVar255 <= fVar211) && bVar83;
        auVar239._12_4_ = -(uint)bVar83;
        iVar170 = movmskps(iVar170,auVar239);
        if (iVar170 == 0) goto LAB_003c6297;
        auVar240._0_8_ =
             CONCAT44(-(uint)(auVar250._4_4_ != 0.0 && bVar86),
                      -(uint)(auVar250._0_4_ != 0.0 && bVar85));
        auVar240._8_4_ = -(uint)(auVar250._8_4_ != 0.0 && bVar84);
        auVar240._12_4_ = -(uint)(auVar250._12_4_ != 0.0 && bVar83);
        iVar170 = movmskps(iVar170,auVar240);
        auVar129._8_8_ = uStack_330;
        auVar129._0_8_ = local_338;
        if (iVar170 != 0) {
          fVar247 = fVar247 * fVar212;
          fVar256 = fVar256 * fVar227;
          fVar267 = fVar267 * fVar254;
          fVar268 = fVar268 * fVar287;
          local_3f8 = (float)((uint)(1.0 - fVar247) & uVar108 | ~uVar108 & (uint)fVar247);
          fStack_3f4 = (float)((uint)(1.0 - fVar256) & uVar109 | ~uVar109 & (uint)fVar256);
          fStack_3f0 = (float)((uint)(1.0 - fVar267) & uVar110 | ~uVar110 & (uint)fVar267);
          fStack_3ec = (float)((uint)(1.0 - fVar268) & uVar111 | ~uVar111 & (uint)fVar268);
          local_1d8 = (float)(~uVar108 & (uint)(auVar330._0_4_ * fVar212) |
                             (uint)(1.0 - auVar330._0_4_ * fVar212) & uVar108);
          fStack_1d4 = (float)(~uVar109 & (uint)(auVar330._4_4_ * fVar227) |
                              (uint)(1.0 - auVar330._4_4_ * fVar227) & uVar109);
          fStack_1d0 = (float)(~uVar110 & (uint)(auVar330._8_4_ * fVar254) |
                              (uint)(1.0 - auVar330._8_4_ * fVar254) & uVar110);
          fStack_1cc = (float)(~uVar111 & (uint)(auVar330._12_4_ * fVar287) |
                              (uint)(1.0 - auVar330._12_4_ * fVar287) & uVar111);
          auVar129._8_4_ = auVar240._8_4_;
          auVar129._0_8_ = auVar240._0_8_;
          auVar129._12_4_ = auVar240._12_4_;
          local_408 = fVar293;
          fStack_404 = fVar226;
          fStack_400 = fVar178;
          fStack_3fc = fVar255;
        }
      }
      iVar170 = movmskps(iVar170,auVar129);
      local_398 = auVar249;
      local_388 = fVar278;
      fStack_384 = fVar278;
      fStack_37c = fVar278;
      local_358 = fVar213;
      fStack_354 = fVar213;
      fStack_34c = fVar213;
      if (iVar170 == 0) {
        bVar107 = 0;
      }
      else {
        fVar211 = (auVar270._0_4_ - (float)local_378._0_4_) * local_3f8 + (float)local_378._0_4_;
        fVar212 = (auVar270._4_4_ - (float)local_378._4_4_) * fStack_3f4 + (float)local_378._4_4_;
        fVar226 = (auVar270._8_4_ - fStack_370) * fStack_3f0 + fStack_370;
        fVar227 = (auVar270._12_4_ - fStack_36c) * fStack_3ec + fStack_36c;
        fVar293 = local_340->depth_scale;
        aVar168._0_4_ = -(uint)(fVar293 * (fVar211 + fVar211) < local_408) & auVar129._0_4_;
        aVar168._4_4_ = -(uint)(fVar293 * (fVar212 + fVar212) < fStack_404) & auVar129._4_4_;
        aVar168._8_4_ = -(uint)(fVar293 * (fVar226 + fVar226) < fStack_400) & auVar129._8_4_;
        aVar168._12_4_ = -(uint)(fVar293 * (fVar227 + fVar227) < fStack_3fc) & auVar129._12_4_;
        uVar108 = movmskps((int)local_340,(undefined1  [16])aVar168);
        if (uVar108 != 0) {
          local_1d8 = local_1d8 + local_1d8 + -1.0;
          fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
          fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
          fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
          bhit.T.field_0.v[1] = fStack_404;
          bhit.T.field_0.v[0] = local_408;
          bhit.T.field_0.v[2] = fStack_400;
          bhit.T.field_0.v[3] = fStack_3fc;
          bhit.i = 0;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_234,local_238);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_22c,fStack_230);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_244,local_248);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_23c,fStack_240);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_254,local_258);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_24c,fStack_250);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_264,local_268);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_25c,fStack_260);
          pRVar96 = (RTCIntersectArguments *)(ulong)(uint)ray->mask;
          bhit.U.field_0.v[0] = local_3f8;
          bhit.U.field_0.v[1] = fStack_3f4;
          bhit.U.field_0.v[2] = fStack_3f0;
          bhit.U.field_0.v[3] = fStack_3ec;
          bhit.V.field_0.v[0] = local_1d8;
          bhit.V.field_0.v[1] = fStack_1d4;
          bhit.V.field_0.v[2] = fStack_1d0;
          bhit.V.field_0.v[3] = fStack_1cc;
          bhit.N = iVar143;
          bhit.valid.field_0 = aVar168;
          if ((pGVar26->mask & ray->mask) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar107 = 1, pRVar96 = context->args,
               pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar293 = 1.0 / (float)local_278._0_4_;
              bhit.vu.field_0.v[0] = fVar293 * (local_3f8 + 0.0);
              bhit.vu.field_0.v[1] = fVar293 * (fStack_3f4 + 1.0);
              bhit.vu.field_0.v[2] = fVar293 * (fStack_3f0 + 2.0);
              bhit.vu.field_0.v[3] = fVar293 * (fStack_3ec + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_1d4,local_1d8);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_1cc,fStack_1d0);
              bhit.vt.field_0.v[1] = fStack_404;
              bhit.vt.field_0.v[0] = local_408;
              bhit.vt.field_0.v[2] = fStack_400;
              bhit.vt.field_0.v[3] = fStack_3fc;
              uVar99 = (ulong)(uVar108 & 0xff);
              uVar97 = 0;
              local_3a0 = lVar106;
              if (uVar99 != 0) {
                for (; ((uVar108 & 0xff) >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                }
              }
              while (uVar99 != 0) {
                local_2ac = bhit.vu.field_0.v[uVar97];
                local_2a8 = bhit.vv.field_0.v[uVar97];
                fVar293 = ray->tfar;
                ray->tfar = bhit.vt.field_0.v[uVar97];
                fVar211 = 1.0 - local_2ac;
                fVar213 = local_2ac * 3.0;
                fVar226 = ((fVar213 + 2.0) * (fVar211 + fVar211) + fVar211 * -3.0 * fVar211) * 0.5;
                fVar212 = (fVar211 * -2.0 * local_2ac + local_2ac * local_2ac) * 0.5;
                fVar213 = (local_2ac * fVar213 + (fVar213 + -5.0) * (local_2ac + local_2ac)) * 0.5;
                fVar211 = (local_2ac * (fVar211 + fVar211) - fVar211 * fVar211) * 0.5;
                local_2b8 = CONCAT44(fVar211 * fStack_234 +
                                     fVar213 * fStack_244 +
                                     fVar226 * fStack_254 + fVar212 * fStack_264,
                                     fVar211 * local_238 +
                                     fVar213 * local_248 + fVar226 * local_258 + fVar212 * local_268
                                    );
                local_2b0 = fVar211 * fStack_230 +
                            fVar213 * fStack_240 + fVar226 * fStack_250 + fVar212 * fStack_260;
                args.context = context->user;
                local_2a4 = SUB84(local_280,0);
                local_2a0 = SUB84(local_348,0);
                local_29c = (args.context)->instID[0];
                local_298 = (args.context)->instPrimID[0];
                local_40c = -1;
                args.valid = &local_40c;
                args.geometryUserPtr = pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_2b8;
                args.N = 1;
                pRVar100 = local_280;
                args.ray = (RTCRayN *)ray;
                if ((pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar26->occlusionFilterN)(&args), pRVar100 = extraout_RDX, *args.valid != 0))
                {
                  pRVar96 = context->args;
                  if ((pRVar96->filter == (RTCFilterFunctionN)0x0) ||
                     ((((pRVar96->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT &&
                       (((pGVar26->field_8).field_0x2 & 0x40) == 0)) ||
                      ((*pRVar96->filter)(&args), pRVar100 = extraout_RDX_00, *args.valid != 0)))) {
                    bVar107 = 1;
                    lVar106 = local_3a0;
                    fVar278 = local_388;
                    fVar337 = fStack_384;
                    fVar339 = fStack_37c;
                    fVar213 = local_358;
                    fVar345 = fStack_354;
                    fVar347 = fStack_34c;
                    goto LAB_003c6262;
                  }
                }
                ray->tfar = fVar293;
                uVar99 = uVar99 ^ 1L << (uVar97 & 0x3f);
                uVar97 = 0;
                if (uVar99 != 0) {
                  for (; (uVar99 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                  }
                }
              }
              bVar107 = 0;
              pRVar100 = (RayQueryContext *)0x0;
              pRVar96 = local_348;
              lVar106 = local_3a0;
              fVar278 = local_388;
              fVar337 = fStack_384;
              fVar339 = fStack_37c;
              fVar213 = local_358;
              fVar345 = fStack_354;
              fVar347 = fStack_34c;
            }
            goto LAB_003c6262;
          }
        }
        bVar107 = 0;
      }
    }
LAB_003c6262:
    uVar102 = SUB84(pRVar96,0);
    if (4 < iVar143) {
      fVar293 = 1.0 / (float)local_278._0_4_;
      pRVar104 = local_348;
      local_388 = fVar278;
      fStack_384 = fVar337;
      fStack_37c = fVar339;
      local_358 = fVar213;
      fStack_354 = fVar345;
      fStack_34c = fVar347;
      for (lVar105 = 4; uVar102 = SUB84(pRVar96,0), lVar105 < lVar106; lVar105 = lVar105 + 4) {
        uVar109 = (uint)lVar105;
        pRVar96 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar101);
        pRVar7 = &pRVar96->flags + lVar105;
        local_3b8 = (float)*pRVar7;
        fStack_3b4 = (float)pRVar7[1];
        fStack_3b0 = (float)pRVar7[2];
        fStack_3ac = (float)pRVar7[3];
        pfVar2 = (float *)(lVar101 + 0x22047f0 + lVar105 * 4);
        fVar211 = *pfVar2;
        fVar212 = pfVar2[1];
        fVar213 = pfVar2[2];
        fVar226 = pfVar2[3];
        pauVar9 = (undefined1 (*) [12])(lVar101 + 0x2204c74 + lVar105 * 4);
        fVar227 = *(float *)*pauVar9;
        fVar178 = *(float *)(*pauVar9 + 4);
        fVar254 = *(float *)(*pauVar9 + 8);
        auVar62 = *pauVar9;
        fVar255 = *(float *)pauVar9[1];
        pfVar2 = (float *)(lVar101 + 0x22050f8 + lVar105 * 4);
        local_368 = *pfVar2;
        fStack_364 = pfVar2[1];
        fStack_360 = pfVar2[2];
        fStack_35c = pfVar2[3];
        local_1c8 = local_218 * local_3b8 +
                    local_208 * fVar211 + local_3c8 * fVar227 + fVar228 * local_368;
        fStack_1c4 = fStack_214 * fStack_3b4 +
                     fStack_204 * fVar212 + fStack_3c4 * fVar178 + fVar228 * fStack_364;
        fStack_1c0 = fStack_210 * fStack_3b0 +
                     fStack_200 * fVar213 + fStack_3c0 * fVar254 + fVar228 * fStack_360;
        fStack_1bc = fStack_20c * fStack_3ac +
                     fStack_1fc * fVar226 + fStack_3bc * fVar255 + fVar228 * fStack_35c;
        local_1b8 = local_198 * local_3b8 +
                    local_328 * fVar211 + local_1a8 * fVar227 + fVar214 * local_368;
        fStack_1b4 = fStack_194 * fStack_3b4 +
                     fStack_324 * fVar212 + fStack_1a4 * fVar178 + fVar214 * fStack_364;
        fStack_1b0 = fStack_190 * fStack_3b0 +
                     fStack_320 * fVar213 + fStack_1a0 * fVar254 + fVar214 * fStack_360;
        fStack_1ac = fStack_18c * fStack_3ac +
                     fStack_31c * fVar226 + fStack_19c * fVar255 + fVar214 * fStack_35c;
        local_398._0_4_ =
             local_178 * local_3b8 +
             local_168 * fVar211 + local_148 * fVar227 + local_158 * local_368;
        local_398._4_4_ =
             fStack_174 * fStack_3b4 +
             fStack_164 * fVar212 + fStack_144 * fVar178 + fStack_154 * fStack_364;
        local_398._8_4_ =
             fStack_170 * fStack_3b0 +
             fStack_160 * fVar213 + fStack_140 * fVar254 + fStack_150 * fStack_360;
        local_398._12_4_ =
             fStack_16c * fStack_3ac +
             fStack_15c * fVar226 + fStack_13c * fVar255 + fStack_14c * fStack_35c;
        pfVar2 = (float *)(catmullrom_basis1 + lVar101 + lVar105 * 4);
        fVar227 = *pfVar2;
        fVar178 = pfVar2[1];
        fVar254 = pfVar2[2];
        fVar287 = pfVar2[3];
        pfVar2 = (float *)(lVar101 + 0x2206c10 + lVar105 * 4);
        fVar266 = *pfVar2;
        fVar271 = pfVar2[1];
        fVar272 = pfVar2[2];
        fVar278 = pfVar2[3];
        pfVar2 = (float *)(lVar101 + 0x2207094 + lVar105 * 4);
        fVar279 = *pfVar2;
        fVar280 = pfVar2[1];
        fVar283 = pfVar2[2];
        fVar291 = pfVar2[3];
        pfVar2 = (float *)(lVar101 + 0x2207518 + lVar105 * 4);
        fVar296 = *pfVar2;
        fVar307 = pfVar2[1];
        fVar309 = pfVar2[2];
        fVar312 = pfVar2[3];
        fVar347 = local_218 * fVar227 +
                  local_208 * fVar266 + local_3c8 * fVar279 + fVar228 * fVar296;
        fVar349 = fStack_214 * fVar178 +
                  fStack_204 * fVar271 + fStack_3c4 * fVar280 + fVar228 * fVar307;
        fVar245 = fStack_210 * fVar254 +
                  fStack_200 * fVar272 + fStack_3c0 * fVar283 + fVar228 * fVar309;
        fVar246 = fStack_20c * fVar287 +
                  fStack_1fc * fVar278 + fStack_3bc * fVar291 + fVar228 * fVar312;
        fVar247 = local_198 * fVar227 +
                  local_328 * fVar266 + local_1a8 * fVar279 + fVar214 * fVar296;
        fVar256 = fStack_194 * fVar178 +
                  fStack_324 * fVar271 + fStack_1a4 * fVar280 + fVar214 * fVar307;
        fVar267 = fStack_190 * fVar254 +
                  fStack_320 * fVar272 + fStack_1a0 * fVar283 + fVar214 * fVar309;
        fVar268 = fStack_18c * fVar287 +
                  fStack_31c * fVar278 + fStack_19c * fVar291 + fVar214 * fVar312;
        auVar305._0_4_ =
             local_178 * fVar227 + local_168 * fVar266 + local_148 * fVar279 + local_158 * fVar296;
        auVar305._4_4_ =
             fStack_174 * fVar178 +
             fStack_164 * fVar271 + fStack_144 * fVar280 + fStack_154 * fVar307;
        auVar305._8_4_ =
             fStack_170 * fVar254 +
             fStack_160 * fVar272 + fStack_140 * fVar283 + fStack_150 * fVar309;
        auVar305._12_4_ =
             fStack_16c * fVar287 +
             fStack_15c * fVar278 + fStack_13c * fVar291 + fStack_14c * fVar312;
        fVar335 = fVar347 - local_1c8;
        fVar337 = fVar349 - fStack_1c4;
        fVar339 = fVar245 - fStack_1c0;
        fVar345 = fVar246 - fStack_1bc;
        fVar321 = fVar247 - local_1b8;
        fVar323 = fVar256 - fStack_1b4;
        fVar326 = fVar267 - fStack_1b0;
        fVar333 = fVar268 - fStack_1ac;
        fVar269 = local_1b8 * fVar335 - local_1c8 * fVar321;
        fVar308 = fStack_1b4 * fVar337 - fStack_1c4 * fVar323;
        fVar310 = fStack_1b0 * fVar339 - fStack_1c0 * fVar326;
        fVar311 = fStack_1ac * fVar345 - fStack_1bc * fVar333;
        auVar184 = maxps(local_398,auVar305);
        bVar83 = fVar269 * fVar269 <=
                 auVar184._0_4_ * auVar184._0_4_ * (fVar335 * fVar335 + fVar321 * fVar321) &&
                 (int)uVar109 < iVar143;
        auVar331._0_4_ = -(uint)bVar83;
        bVar84 = fVar308 * fVar308 <=
                 auVar184._4_4_ * auVar184._4_4_ * (fVar337 * fVar337 + fVar323 * fVar323) &&
                 (int)(uVar109 | 1) < iVar143;
        auVar331._4_4_ = -(uint)bVar84;
        bVar85 = fVar310 * fVar310 <=
                 auVar184._8_4_ * auVar184._8_4_ * (fVar339 * fVar339 + fVar326 * fVar326) &&
                 (int)(uVar109 | 2) < iVar143;
        auVar331._8_4_ = -(uint)bVar85;
        bVar86 = fVar311 * fVar311 <=
                 auVar184._12_4_ * auVar184._12_4_ * (fVar345 * fVar345 + fVar333 * fVar333) &&
                 (int)(uVar109 | 3) < iVar143;
        auVar331._12_4_ = -(uint)bVar86;
        uVar108 = movmskps((int)pRVar100,auVar331);
        pRVar100 = (RayQueryContext *)(ulong)uVar108;
        if (uVar108 != 0) {
          fVar135 = fVar296 * local_358 + fVar279 * local_388 + fVar266 * fVar286 +
                    fVar227 * fVar284;
          fVar138 = fVar307 * fStack_354 + fVar280 * fStack_384 + fVar271 * fVar286 +
                    fVar178 * fVar284;
          fVar141 = fVar309 * fStack_350 + fVar283 * fStack_380 + fVar272 * fVar286 +
                    fVar254 * fVar284;
          fVar173 = fVar312 * fStack_34c + fVar291 * fStack_37c + fVar278 * fVar286 +
                    fVar287 * fVar284;
          local_2e8 = auVar62._0_4_;
          fStack_2e4 = auVar62._4_4_;
          fStack_2e0 = auVar62._8_4_;
          local_368 = local_368 * local_358 + local_2e8 * local_388 + fVar211 * fVar286 +
                      local_3b8 * fVar284;
          fStack_364 = fStack_364 * fStack_354 + fStack_2e4 * fStack_384 + fVar212 * fVar286 +
                       fStack_3b4 * fVar284;
          fStack_360 = fStack_360 * fStack_350 + fStack_2e0 * fStack_380 + fVar213 * fVar286 +
                       fStack_3b0 * fVar284;
          fStack_35c = fStack_35c * fStack_34c + fVar255 * fStack_37c + fVar226 * fVar286 +
                       fStack_3ac * fVar284;
          pfVar2 = (float *)(lVar101 + 0x220557c + lVar105 * 4);
          fVar211 = *pfVar2;
          fVar212 = pfVar2[1];
          fVar213 = pfVar2[2];
          fVar226 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x2205a00 + lVar105 * 4);
          fVar227 = *pfVar2;
          fVar178 = pfVar2[1];
          fVar254 = pfVar2[2];
          fVar255 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x2205e84 + lVar105 * 4);
          fVar287 = *pfVar2;
          fVar266 = pfVar2[1];
          fVar271 = pfVar2[2];
          fVar272 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x2206308 + lVar105 * 4);
          fVar278 = *pfVar2;
          fVar279 = pfVar2[1];
          fVar280 = pfVar2[2];
          fVar283 = pfVar2[3];
          fVar338 = local_218 * fVar211 +
                    local_208 * fVar227 + local_3c8 * fVar287 + fVar228 * fVar278;
          fVar340 = fStack_214 * fVar212 +
                    fStack_204 * fVar178 + fStack_3c4 * fVar266 + fVar228 * fVar279;
          fVar346 = fStack_210 * fVar213 +
                    fStack_200 * fVar254 + fStack_3c0 * fVar271 + fVar228 * fVar280;
          fVar348 = fStack_20c * fVar226 +
                    fStack_1fc * fVar255 + fStack_3bc * fVar272 + fVar228 * fVar283;
          fVar176 = local_198 * fVar211 +
                    local_328 * fVar227 + local_1a8 * fVar287 + fVar214 * fVar278;
          fVar288 = fStack_194 * fVar212 +
                    fStack_324 * fVar178 + fStack_1a4 * fVar266 + fVar214 * fVar279;
          fVar292 = fStack_190 * fVar213 +
                    fStack_320 * fVar254 + fStack_1a0 * fVar271 + fVar214 * fVar280;
          fVar294 = fStack_18c * fVar226 +
                    fStack_31c * fVar255 + fStack_19c * fVar272 + fVar214 * fVar283;
          pfVar2 = (float *)(lVar101 + 0x220799c + lVar105 * 4);
          fVar291 = *pfVar2;
          fVar296 = pfVar2[1];
          fVar307 = pfVar2[2];
          fVar309 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x22082a4 + lVar105 * 4);
          fVar312 = *pfVar2;
          fVar269 = pfVar2[1];
          fVar308 = pfVar2[2];
          fVar310 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x2208728 + lVar105 * 4);
          fVar311 = *pfVar2;
          fVar313 = pfVar2[1];
          fVar322 = pfVar2[2];
          fVar324 = pfVar2[3];
          pfVar2 = (float *)(lVar101 + 0x2207e20 + lVar105 * 4);
          fVar325 = *pfVar2;
          fVar114 = pfVar2[1];
          fVar115 = pfVar2[2];
          fVar134 = pfVar2[3];
          fVar137 = local_218 * fVar291 +
                    local_208 * fVar325 + local_3c8 * fVar312 + fVar228 * fVar311;
          fVar140 = fStack_214 * fVar296 +
                    fStack_204 * fVar114 + fStack_3c4 * fVar269 + fVar228 * fVar313;
          fVar144 = fStack_210 * fVar307 +
                    fStack_200 * fVar115 + fStack_3c0 * fVar308 + fVar228 * fVar322;
          fVar175 = fStack_20c * fVar309 +
                    fStack_1fc * fVar134 + fStack_3bc * fVar310 + fVar228 * fVar324;
          fVar295 = local_198 * fVar291 +
                    local_328 * fVar325 + local_1a8 * fVar312 + fVar214 * fVar311;
          fVar327 = fStack_194 * fVar296 +
                    fStack_324 * fVar114 + fStack_1a4 * fVar269 + fVar214 * fVar313;
          fVar334 = fStack_190 * fVar307 +
                    fStack_320 * fVar115 + fStack_1a0 * fVar308 + fVar214 * fVar322;
          fVar336 = fStack_18c * fVar309 +
                    fStack_31c * fVar134 + fStack_19c * fVar310 + fVar214 * fVar324;
          auVar306._0_8_ = CONCAT44(fVar340,fVar338) & 0x7fffffff7fffffff;
          auVar306._8_4_ = ABS(fVar346);
          auVar306._12_4_ = ABS(fVar348);
          auVar251._0_8_ = CONCAT44(fVar288,fVar176) & 0x7fffffff7fffffff;
          auVar251._8_4_ = ABS(fVar292);
          auVar251._12_4_ = ABS(fVar294);
          auVar184 = maxps(auVar306,auVar251);
          auVar319._0_8_ =
               CONCAT44(fVar212 * fVar284 +
                        fVar178 * fVar286 + fVar266 * fStack_384 + fVar279 * fStack_354,
                        fVar211 * fVar284 +
                        fVar227 * fVar286 + fVar287 * local_388 + fVar278 * local_358) &
               0x7fffffff7fffffff;
          auVar319._8_4_ =
               ABS(fVar213 * fVar284 +
                   fVar254 * fVar286 + fVar271 * fStack_380 + fVar280 * fStack_350);
          auVar319._12_4_ =
               ABS(fVar226 * fVar284 +
                   fVar255 * fVar286 + fVar272 * fStack_37c + fVar283 * fStack_34c);
          auVar184 = maxps(auVar184,auVar319);
          uVar108 = -(uint)(local_448 <= auVar184._0_4_);
          uVar110 = -(uint)(local_448 <= auVar184._4_4_);
          uVar111 = -(uint)(local_448 <= auVar184._8_4_);
          uVar112 = -(uint)(local_448 <= auVar184._12_4_);
          auVar252._0_4_ = ~uVar108 & (uint)fVar335;
          auVar252._4_4_ = ~uVar110 & (uint)fVar337;
          auVar252._8_4_ = ~uVar111 & (uint)fVar339;
          auVar252._12_4_ = ~uVar112 & (uint)fVar345;
          auVar290._0_4_ = (uint)fVar338 & uVar108;
          auVar290._4_4_ = (uint)fVar340 & uVar110;
          auVar290._8_4_ = (uint)fVar346 & uVar111;
          auVar290._12_4_ = (uint)fVar348 & uVar112;
          auVar290 = auVar290 | auVar252;
          fVar176 = (float)(~uVar108 & (uint)fVar321 | (uint)fVar176 & uVar108);
          fVar288 = (float)(~uVar110 & (uint)fVar323 | (uint)fVar288 & uVar110);
          fVar292 = (float)(~uVar111 & (uint)fVar326 | (uint)fVar292 & uVar111);
          fVar294 = (float)(~uVar112 & (uint)fVar333 | (uint)fVar294 & uVar112);
          auVar320._0_8_ = CONCAT44(fVar140,fVar137) & 0x7fffffff7fffffff;
          auVar320._8_4_ = ABS(fVar144);
          auVar320._12_4_ = ABS(fVar175);
          auVar207._0_8_ = CONCAT44(fVar327,fVar295) & 0x7fffffff7fffffff;
          auVar207._8_4_ = ABS(fVar334);
          auVar207._12_4_ = ABS(fVar336);
          auVar184 = maxps(auVar320,auVar207);
          auVar130._0_8_ =
               CONCAT44(fVar296 * fVar284 +
                        fVar114 * fVar286 + fVar269 * fStack_384 + fVar313 * fStack_354,
                        fVar291 * fVar284 +
                        fVar325 * fVar286 + fVar312 * local_388 + fVar311 * local_358) &
               0x7fffffff7fffffff;
          auVar130._8_4_ =
               ABS(fVar307 * fVar284 +
                   fVar115 * fVar286 + fVar308 * fStack_380 + fVar322 * fStack_350);
          auVar130._12_4_ =
               ABS(fVar309 * fVar284 +
                   fVar134 * fVar286 + fVar310 * fStack_37c + fVar324 * fStack_34c);
          auVar184 = maxps(auVar184,auVar130);
          uVar108 = -(uint)(local_448 <= auVar184._0_4_);
          uVar110 = -(uint)(local_448 <= auVar184._4_4_);
          uVar111 = -(uint)(local_448 <= auVar184._8_4_);
          uVar112 = -(uint)(local_448 <= auVar184._12_4_);
          fVar211 = (float)((uint)fVar137 & uVar108 | ~uVar108 & (uint)fVar335);
          fVar212 = (float)((uint)fVar140 & uVar110 | ~uVar110 & (uint)fVar337);
          fVar213 = (float)((uint)fVar144 & uVar111 | ~uVar111 & (uint)fVar339);
          fVar226 = (float)((uint)fVar175 & uVar112 | ~uVar112 & (uint)fVar345);
          fVar312 = (float)(~uVar108 & (uint)fVar321 | (uint)fVar295 & uVar108);
          fVar323 = (float)(~uVar110 & (uint)fVar323 | (uint)fVar327 & uVar110);
          fVar337 = (float)(~uVar111 & (uint)fVar326 | (uint)fVar334 & uVar111);
          fVar333 = (float)(~uVar112 & (uint)fVar333 | (uint)fVar336 & uVar112);
          fVar272 = auVar290._0_4_;
          fVar227 = auVar290._4_4_;
          fVar254 = auVar290._8_4_;
          fVar287 = auVar290._12_4_;
          auVar241._0_4_ = fVar176 * fVar176 + fVar272 * fVar272;
          auVar241._4_4_ = fVar288 * fVar288 + fVar227 * fVar227;
          auVar241._8_4_ = fVar292 * fVar292 + fVar254 * fVar254;
          auVar241._12_4_ = fVar294 * fVar294 + fVar287 * fVar287;
          auVar184 = rsqrtps(auVar252,auVar241);
          fVar178 = auVar184._0_4_;
          fVar255 = auVar184._4_4_;
          fVar266 = auVar184._8_4_;
          fVar271 = auVar184._12_4_;
          auVar253._0_4_ = fVar178 * fVar178 * auVar241._0_4_ * 0.5 * fVar178;
          auVar253._4_4_ = fVar255 * fVar255 * auVar241._4_4_ * 0.5 * fVar255;
          auVar253._8_4_ = fVar266 * fVar266 * auVar241._8_4_ * 0.5 * fVar266;
          auVar253._12_4_ = fVar271 * fVar271 * auVar241._12_4_ * 0.5 * fVar271;
          fVar291 = fVar178 * 1.5 - auVar253._0_4_;
          fVar296 = fVar255 * 1.5 - auVar253._4_4_;
          fVar307 = fVar266 * 1.5 - auVar253._8_4_;
          fVar309 = fVar271 * 1.5 - auVar253._12_4_;
          auVar242._0_4_ = fVar312 * fVar312 + fVar211 * fVar211;
          auVar242._4_4_ = fVar323 * fVar323 + fVar212 * fVar212;
          auVar242._8_4_ = fVar337 * fVar337 + fVar213 * fVar213;
          auVar242._12_4_ = fVar333 * fVar333 + fVar226 * fVar226;
          auVar184 = rsqrtps(auVar253,auVar242);
          fVar178 = auVar184._0_4_;
          fVar255 = auVar184._4_4_;
          fVar266 = auVar184._8_4_;
          fVar271 = auVar184._12_4_;
          fVar278 = fVar178 * 1.5 - fVar178 * fVar178 * auVar242._0_4_ * 0.5 * fVar178;
          fVar279 = fVar255 * 1.5 - fVar255 * fVar255 * auVar242._4_4_ * 0.5 * fVar255;
          fVar280 = fVar266 * 1.5 - fVar266 * fVar266 * auVar242._8_4_ * 0.5 * fVar266;
          fVar283 = fVar271 * 1.5 - fVar271 * fVar271 * auVar242._12_4_ * 0.5 * fVar271;
          fVar321 = fVar176 * fVar291 * (float)local_398._0_4_;
          fVar326 = fVar288 * fVar296 * (float)local_398._4_4_;
          fVar335 = fVar292 * fVar307 * (float)local_398._8_4_;
          fVar339 = fVar294 * fVar309 * (float)local_398._12_4_;
          fVar178 = -fVar272 * fVar291 * (float)local_398._0_4_;
          fVar255 = -fVar227 * fVar296 * (float)local_398._4_4_;
          fVar266 = -fVar254 * fVar307 * (float)local_398._8_4_;
          fVar272 = -fVar287 * fVar309 * (float)local_398._12_4_;
          fVar227 = fVar291 * 0.0 * (float)local_398._0_4_;
          fVar254 = fVar296 * 0.0 * (float)local_398._4_4_;
          fVar287 = fVar307 * 0.0 * (float)local_398._8_4_;
          fVar271 = fVar309 * 0.0 * (float)local_398._12_4_;
          local_3b8 = local_368 + fVar227;
          fStack_3b4 = fStack_364 + fVar254;
          fStack_3b0 = fStack_360 + fVar287;
          fStack_3ac = fStack_35c + fVar271;
          fVar296 = fVar312 * fVar278 * auVar305._0_4_;
          fVar309 = fVar323 * fVar279 * auVar305._4_4_;
          fVar144 = fVar337 * fVar280 * auVar305._8_4_;
          fVar175 = fVar333 * fVar283 * auVar305._12_4_;
          fVar308 = fVar347 + fVar296;
          fVar310 = fVar349 + fVar309;
          fVar311 = fVar245 + fVar144;
          fVar313 = fVar246 + fVar175;
          fVar211 = -fVar211 * fVar278 * auVar305._0_4_;
          fVar212 = -fVar212 * fVar279 * auVar305._4_4_;
          fVar213 = -fVar213 * fVar280 * auVar305._8_4_;
          fVar226 = -fVar226 * fVar283 * auVar305._12_4_;
          fVar322 = fVar247 + fVar211;
          fVar324 = fVar256 + fVar212;
          fVar325 = fVar267 + fVar213;
          fVar114 = fVar268 + fVar226;
          fVar278 = fVar278 * 0.0 * auVar305._0_4_;
          fVar279 = fVar279 * 0.0 * auVar305._4_4_;
          fVar280 = fVar280 * 0.0 * auVar305._8_4_;
          fVar283 = fVar283 * 0.0 * auVar305._12_4_;
          fVar333 = local_1c8 - fVar321;
          fVar337 = fStack_1c4 - fVar326;
          fVar345 = fStack_1c0 - fVar335;
          fVar269 = fStack_1bc - fVar339;
          fVar115 = fVar135 + fVar278;
          fVar134 = fVar138 + fVar279;
          fVar137 = fVar141 + fVar280;
          fVar140 = fVar173 + fVar283;
          fVar291 = local_1b8 - fVar178;
          fVar307 = fStack_1b4 - fVar255;
          fVar312 = fStack_1b0 - fVar266;
          fVar323 = fStack_1ac - fVar272;
          fVar227 = local_368 - fVar227;
          fVar254 = fStack_364 - fVar254;
          fVar287 = fStack_360 - fVar287;
          fVar271 = fStack_35c - fVar271;
          uVar108 = -(uint)(0.0 < (fVar291 * (fVar115 - fVar227) - fVar227 * (fVar322 - fVar291)) *
                                  0.0 + (fVar227 * (fVar308 - fVar333) -
                                        (fVar115 - fVar227) * fVar333) * 0.0 +
                                        ((fVar322 - fVar291) * fVar333 -
                                        (fVar308 - fVar333) * fVar291));
          uVar110 = -(uint)(0.0 < (fVar307 * (fVar134 - fVar254) - fVar254 * (fVar324 - fVar307)) *
                                  0.0 + (fVar254 * (fVar310 - fVar337) -
                                        (fVar134 - fVar254) * fVar337) * 0.0 +
                                        ((fVar324 - fVar307) * fVar337 -
                                        (fVar310 - fVar337) * fVar307));
          uVar111 = -(uint)(0.0 < (fVar312 * (fVar137 - fVar287) - fVar287 * (fVar325 - fVar312)) *
                                  0.0 + (fVar287 * (fVar311 - fVar345) -
                                        (fVar137 - fVar287) * fVar345) * 0.0 +
                                        ((fVar325 - fVar312) * fVar345 -
                                        (fVar311 - fVar345) * fVar312));
          uVar112 = -(uint)(0.0 < (fVar323 * (fVar140 - fVar271) - fVar271 * (fVar114 - fVar323)) *
                                  0.0 + (fVar271 * (fVar313 - fVar269) -
                                        (fVar140 - fVar271) * fVar269) * 0.0 +
                                        ((fVar114 - fVar323) * fVar269 -
                                        (fVar313 - fVar269) * fVar323));
          local_378._0_4_ =
               (uint)(fVar347 - fVar296) & uVar108 | ~uVar108 & (uint)(local_1c8 + fVar321);
          local_378._4_4_ =
               (uint)(fVar349 - fVar309) & uVar110 | ~uVar110 & (uint)(fStack_1c4 + fVar326);
          fStack_370 = (float)((uint)(fVar245 - fVar144) & uVar111 |
                              ~uVar111 & (uint)(fStack_1c0 + fVar335));
          fStack_36c = (float)((uint)(fVar246 - fVar175) & uVar112 |
                              ~uVar112 & (uint)(fStack_1bc + fVar339));
          fVar245 = (float)((uint)(fVar247 - fVar211) & uVar108 |
                           ~uVar108 & (uint)(local_1b8 + fVar178));
          fVar246 = (float)((uint)(fVar256 - fVar212) & uVar110 |
                           ~uVar110 & (uint)(fStack_1b4 + fVar255));
          fVar247 = (float)((uint)(fVar267 - fVar213) & uVar111 |
                           ~uVar111 & (uint)(fStack_1b0 + fVar266));
          fVar256 = (float)((uint)(fVar268 - fVar226) & uVar112 |
                           ~uVar112 & (uint)(fStack_1ac + fVar272));
          fVar278 = (float)((uint)(fVar135 - fVar278) & uVar108 | ~uVar108 & (uint)local_3b8);
          fVar279 = (float)((uint)(fVar138 - fVar279) & uVar110 | ~uVar110 & (uint)fStack_3b4);
          fVar280 = (float)((uint)(fVar141 - fVar280) & uVar111 | ~uVar111 & (uint)fStack_3b0);
          fVar283 = (float)((uint)(fVar173 - fVar283) & uVar112 | ~uVar112 & (uint)fStack_3ac);
          fVar335 = (float)((uint)fVar333 & uVar108 | ~uVar108 & (uint)fVar308);
          fVar339 = (float)((uint)fVar337 & uVar110 | ~uVar110 & (uint)fVar310);
          fVar347 = (float)((uint)fVar345 & uVar111 | ~uVar111 & (uint)fVar311);
          fVar349 = (float)((uint)fVar269 & uVar112 | ~uVar112 & (uint)fVar313);
          fVar296 = (float)((uint)fVar291 & uVar108 | ~uVar108 & (uint)fVar322);
          fVar309 = (float)((uint)fVar307 & uVar110 | ~uVar110 & (uint)fVar324);
          fVar321 = (float)((uint)fVar312 & uVar111 | ~uVar111 & (uint)fVar325);
          fVar326 = (float)((uint)fVar323 & uVar112 | ~uVar112 & (uint)fVar114);
          fVar178 = (float)((uint)fVar227 & uVar108 | ~uVar108 & (uint)fVar115);
          fVar255 = (float)((uint)fVar254 & uVar110 | ~uVar110 & (uint)fVar134);
          fVar266 = (float)((uint)fVar287 & uVar111 | ~uVar111 & (uint)fVar137);
          fVar272 = (float)((uint)fVar271 & uVar112 | ~uVar112 & (uint)fVar140);
          fVar333 = (float)((uint)fVar308 & uVar108 | ~uVar108 & (uint)fVar333) -
                    (float)local_378._0_4_;
          fVar337 = (float)((uint)fVar310 & uVar110 | ~uVar110 & (uint)fVar337) -
                    (float)local_378._4_4_;
          fVar345 = (float)((uint)fVar311 & uVar111 | ~uVar111 & (uint)fVar345) - fStack_370;
          fVar267 = (float)((uint)fVar313 & uVar112 | ~uVar112 & (uint)fVar269) - fStack_36c;
          fVar291 = (float)((uint)fVar322 & uVar108 | ~uVar108 & (uint)fVar291) - fVar245;
          fVar307 = (float)((uint)fVar324 & uVar110 | ~uVar110 & (uint)fVar307) - fVar246;
          fVar312 = (float)((uint)fVar325 & uVar111 | ~uVar111 & (uint)fVar312) - fVar247;
          fVar323 = (float)((uint)fVar114 & uVar112 | ~uVar112 & (uint)fVar323) - fVar256;
          fVar268 = (float)((uint)fVar115 & uVar108 | ~uVar108 & (uint)fVar227) - fVar278;
          fVar269 = (float)((uint)fVar134 & uVar110 | ~uVar110 & (uint)fVar254) - fVar279;
          fVar308 = (float)((uint)fVar137 & uVar111 | ~uVar111 & (uint)fVar287) - fVar280;
          fVar310 = (float)((uint)fVar140 & uVar112 | ~uVar112 & (uint)fVar271) - fVar283;
          fVar325 = (float)local_378._0_4_ - fVar335;
          fVar114 = (float)local_378._4_4_ - fVar339;
          fVar115 = fStack_370 - fVar347;
          fVar134 = fStack_36c - fVar349;
          fVar211 = fVar245 - fVar296;
          fVar212 = fVar246 - fVar309;
          fVar213 = fVar247 - fVar321;
          fVar226 = fVar256 - fVar326;
          fVar227 = fVar278 - fVar178;
          fVar254 = fVar279 - fVar255;
          fVar287 = fVar280 - fVar266;
          fVar271 = fVar283 - fVar272;
          fVar311 = (fVar245 * fVar268 - fVar278 * fVar291) * 0.0 +
                    (fVar278 * fVar333 - (float)local_378._0_4_ * fVar268) * 0.0 +
                    ((float)local_378._0_4_ * fVar291 - fVar245 * fVar333);
          fVar313 = (fVar246 * fVar269 - fVar279 * fVar307) * 0.0 +
                    (fVar279 * fVar337 - (float)local_378._4_4_ * fVar269) * 0.0 +
                    ((float)local_378._4_4_ * fVar307 - fVar246 * fVar337);
          auVar223._4_4_ = fVar313;
          auVar223._0_4_ = fVar311;
          fVar322 = (fVar247 * fVar308 - fVar280 * fVar312) * 0.0 +
                    (fVar280 * fVar345 - fStack_370 * fVar308) * 0.0 +
                    (fStack_370 * fVar312 - fVar247 * fVar345);
          fVar324 = (fVar256 * fVar310 - fVar283 * fVar323) * 0.0 +
                    (fVar283 * fVar267 - fStack_36c * fVar310) * 0.0 +
                    (fStack_36c * fVar323 - fVar256 * fVar267);
          auVar332._0_4_ =
               (fVar296 * fVar227 - fVar178 * fVar211) * 0.0 +
               (fVar178 * fVar325 - fVar335 * fVar227) * 0.0 +
               (fVar335 * fVar211 - fVar296 * fVar325);
          auVar332._4_4_ =
               (fVar309 * fVar254 - fVar255 * fVar212) * 0.0 +
               (fVar255 * fVar114 - fVar339 * fVar254) * 0.0 +
               (fVar339 * fVar212 - fVar309 * fVar114);
          auVar332._8_4_ =
               (fVar321 * fVar287 - fVar266 * fVar213) * 0.0 +
               (fVar266 * fVar115 - fVar347 * fVar287) * 0.0 +
               (fVar347 * fVar213 - fVar321 * fVar115);
          auVar332._12_4_ =
               (fVar326 * fVar271 - fVar272 * fVar226) * 0.0 +
               (fVar272 * fVar134 - fVar349 * fVar271) * 0.0 +
               (fVar349 * fVar226 - fVar326 * fVar134);
          auVar223._8_4_ = fVar322;
          auVar223._12_4_ = fVar324;
          auVar184 = maxps(auVar223,auVar332);
          bVar83 = auVar184._0_4_ <= 0.0 && bVar83;
          auVar224._0_4_ = -(uint)bVar83;
          bVar84 = auVar184._4_4_ <= 0.0 && bVar84;
          auVar224._4_4_ = -(uint)bVar84;
          bVar85 = auVar184._8_4_ <= 0.0 && bVar85;
          auVar224._8_4_ = -(uint)bVar85;
          bVar86 = auVar184._12_4_ <= 0.0 && bVar86;
          auVar224._12_4_ = -(uint)bVar86;
          iVar170 = movmskps((int)(catmullrom_basis1 + lVar101),auVar224);
          if (iVar170 == 0) {
LAB_003c7068:
            auVar209._8_8_ = uStack_330;
            auVar209._0_8_ = local_338;
          }
          else {
            fVar178 = ray->tfar;
            fVar266 = fVar211 * fVar268 - fVar227 * fVar291;
            fVar272 = fVar212 * fVar269 - fVar254 * fVar307;
            fVar296 = fVar213 * fVar308 - fVar287 * fVar312;
            fVar309 = fVar226 * fVar310 - fVar271 * fVar323;
            fVar227 = fVar227 * fVar333 - fVar268 * fVar325;
            fVar254 = fVar254 * fVar337 - fVar269 * fVar114;
            fVar255 = fVar287 * fVar345 - fVar308 * fVar115;
            fVar287 = fVar271 * fVar267 - fVar310 * fVar134;
            fVar271 = fVar325 * fVar291 - fVar211 * fVar333;
            fVar291 = fVar114 * fVar307 - fVar212 * fVar337;
            fVar307 = fVar115 * fVar312 - fVar213 * fVar345;
            fVar312 = fVar134 * fVar323 - fVar226 * fVar267;
            auVar208._0_4_ = fVar227 * 0.0 + fVar271;
            auVar208._4_4_ = fVar254 * 0.0 + fVar291;
            auVar208._8_4_ = fVar255 * 0.0 + fVar307;
            auVar208._12_4_ = fVar287 * 0.0 + fVar312;
            auVar264._0_4_ = fVar266 * 0.0 + auVar208._0_4_;
            auVar264._4_4_ = fVar272 * 0.0 + auVar208._4_4_;
            auVar264._8_4_ = fVar296 * 0.0 + auVar208._8_4_;
            auVar264._12_4_ = fVar309 * 0.0 + auVar208._12_4_;
            auVar184 = rcpps(auVar208,auVar264);
            fVar211 = auVar184._0_4_;
            fVar212 = auVar184._4_4_;
            fVar213 = auVar184._8_4_;
            fVar226 = auVar184._12_4_;
            fVar211 = (1.0 - auVar264._0_4_ * fVar211) * fVar211 + fVar211;
            fVar212 = (1.0 - auVar264._4_4_ * fVar212) * fVar212 + fVar212;
            fVar213 = (1.0 - auVar264._8_4_ * fVar213) * fVar213 + fVar213;
            fVar226 = (1.0 - auVar264._12_4_ * fVar226) * fVar226 + fVar226;
            fVar227 = (fVar278 * fVar271 + fVar245 * fVar227 + (float)local_378._0_4_ * fVar266) *
                      fVar211;
            fVar254 = (fVar279 * fVar291 + fVar246 * fVar254 + (float)local_378._4_4_ * fVar272) *
                      fVar212;
            aVar265.v[1] = fVar254;
            aVar265.v[0] = fVar227;
            fVar255 = (fVar280 * fVar307 + fVar247 * fVar255 + fStack_370 * fVar296) * fVar213;
            fVar287 = (fVar283 * fVar312 + fVar256 * fVar287 + fStack_36c * fVar309) * fVar226;
            bVar83 = (local_1f8 <= fVar227 && fVar227 <= fVar178) && bVar83;
            auVar243._0_4_ = -(uint)bVar83;
            bVar84 = (fStack_1f4 <= fVar254 && fVar254 <= fVar178) && bVar84;
            auVar243._4_4_ = -(uint)bVar84;
            bVar85 = (fStack_1f0 <= fVar255 && fVar255 <= fVar178) && bVar85;
            auVar243._8_4_ = -(uint)bVar85;
            bVar86 = (fStack_1ec <= fVar287 && fVar287 <= fVar178) && bVar86;
            auVar243._12_4_ = -(uint)bVar86;
            iVar170 = movmskps(iVar170,auVar243);
            if (iVar170 == 0) goto LAB_003c7068;
            auVar244._0_8_ =
                 CONCAT44(-(uint)(auVar264._4_4_ != 0.0 && bVar84),
                          -(uint)(auVar264._0_4_ != 0.0 && bVar83));
            auVar244._8_4_ = -(uint)(auVar264._8_4_ != 0.0 && bVar85);
            auVar244._12_4_ = -(uint)(auVar264._12_4_ != 0.0 && bVar86);
            iVar170 = movmskps(iVar170,auVar244);
            auVar209._8_8_ = uStack_330;
            auVar209._0_8_ = local_338;
            if (iVar170 != 0) {
              fVar311 = fVar311 * fVar211;
              fVar313 = fVar313 * fVar212;
              fVar322 = fVar322 * fVar213;
              fVar324 = fVar324 * fVar226;
              local_3d8 = (float)((uint)(1.0 - fVar311) & uVar108 | ~uVar108 & (uint)fVar311);
              fStack_3d4 = (float)((uint)(1.0 - fVar313) & uVar110 | ~uVar110 & (uint)fVar313);
              fStack_3d0 = (float)((uint)(1.0 - fVar322) & uVar111 | ~uVar111 & (uint)fVar322);
              fStack_3cc = (float)((uint)(1.0 - fVar324) & uVar112 | ~uVar112 & (uint)fVar324);
              local_1e8 = (float)(~uVar108 & (uint)(auVar332._0_4_ * fVar211) |
                                 (uint)(1.0 - auVar332._0_4_ * fVar211) & uVar108);
              fStack_1e4 = (float)(~uVar110 & (uint)(auVar332._4_4_ * fVar212) |
                                  (uint)(1.0 - auVar332._4_4_ * fVar212) & uVar110);
              fStack_1e0 = (float)(~uVar111 & (uint)(auVar332._8_4_ * fVar213) |
                                  (uint)(1.0 - auVar332._8_4_ * fVar213) & uVar111);
              fStack_1dc = (float)(~uVar112 & (uint)(auVar332._12_4_ * fVar226) |
                                  (uint)(1.0 - auVar332._12_4_ * fVar226) & uVar112);
              auVar209._8_4_ = auVar244._8_4_;
              auVar209._0_8_ = auVar244._0_8_;
              auVar209._12_4_ = auVar244._12_4_;
              aVar265.v[2] = fVar255;
              aVar265.v[3] = fVar287;
              local_3e8 = aVar265;
            }
          }
          iVar170 = movmskps(iVar170,auVar209);
          _local_278 = auVar331;
          _local_228 = auVar305;
          if (iVar170 != 0) {
            fVar212 = (auVar305._0_4_ - (float)local_398._0_4_) * local_3d8 + (float)local_398._0_4_
            ;
            fVar213 = (auVar305._4_4_ - (float)local_398._4_4_) * fStack_3d4 +
                      (float)local_398._4_4_;
            fVar226 = (auVar305._8_4_ - (float)local_398._8_4_) * fStack_3d0 +
                      (float)local_398._8_4_;
            fVar227 = (auVar305._12_4_ - (float)local_398._12_4_) * fStack_3cc +
                      (float)local_398._12_4_;
            fVar211 = local_340->depth_scale;
            aVar131._0_4_ = -(uint)(fVar211 * (fVar212 + fVar212) < local_3e8.v[0]) & auVar209._0_4_
            ;
            aVar131._4_4_ = -(uint)(fVar211 * (fVar213 + fVar213) < local_3e8.v[1]) & auVar209._4_4_
            ;
            aVar131._8_4_ = -(uint)(fVar211 * (fVar226 + fVar226) < local_3e8.v[2]) & auVar209._8_4_
            ;
            aVar131._12_4_ =
                 -(uint)(fVar211 * (fVar227 + fVar227) < local_3e8.v[3]) & auVar209._12_4_;
            uVar108 = movmskps((int)local_340,(undefined1  [16])aVar131);
            if (uVar108 != 0) {
              local_1e8 = local_1e8 + local_1e8 + -1.0;
              fStack_1e4 = fStack_1e4 + fStack_1e4 + -1.0;
              fStack_1e0 = fStack_1e0 + fStack_1e0 + -1.0;
              fStack_1dc = fStack_1dc + fStack_1dc + -1.0;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_234,local_238);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_22c,fStack_230);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_244,local_248);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_23c,fStack_240);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_254,local_258);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_24c,fStack_250);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_264,local_268);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_25c,fStack_260);
              auVar98 = (undefined1  [8])(context->scene->geometries).items[(long)pRVar104].ptr;
              pRVar100 = context;
              bhit.U.field_0.v[0] = local_3d8;
              bhit.U.field_0.v[1] = fStack_3d4;
              bhit.U.field_0.v[2] = fStack_3d0;
              bhit.U.field_0.v[3] = fStack_3cc;
              bhit.V.field_0.v[0] = local_1e8;
              bhit.V.field_0.v[1] = fStack_1e4;
              bhit.V.field_0.v[2] = fStack_1e0;
              bhit.V.field_0.v[3] = fStack_1dc;
              bhit.T.field_0 = local_3e8;
              bhit.i = uVar109;
              bhit.valid.field_0 = aVar131;
              if ((((Geometry *)auVar98)->mask & ray->mask) == 0) {
                pRVar96 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar143;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar96 = (RTCIntersectArguments *)
                                 CONCAT71((int7)((ulong)context->args >> 8),1), bhit.N = iVar143,
                      ((Geometry *)auVar98)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar211 = (float)(int)uVar109;
                bhit.vu.field_0.v[0] = (fVar211 + local_3d8 + 0.0) * fVar293;
                bhit.vu.field_0.v[1] = (fVar211 + fStack_3d4 + 1.0) * fVar293;
                bhit.vu.field_0.v[2] = (fVar211 + fStack_3d0 + 2.0) * fVar293;
                bhit.vu.field_0.v[3] = (fVar211 + fStack_3cc + 3.0) * fVar293;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1e4,local_1e8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1dc,fStack_1e0);
                bhit.vt.field_0 = local_3e8;
                uVar99 = (ulong)(uVar108 & 0xff);
                uVar97 = 0;
                if (uVar99 != 0) {
                  for (; ((uVar108 & 0xff) >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                  }
                }
                local_378 = auVar98;
                local_3a0 = lVar106;
                bhit.N = iVar143;
                while (uVar99 != 0) {
                  local_2ac = bhit.vu.field_0.v[uVar97];
                  local_2a8 = bhit.vv.field_0.v[uVar97];
                  local_368 = ray->tfar;
                  ray->tfar = bhit.vt.field_0.v[uVar97];
                  fVar211 = 1.0 - local_2ac;
                  fVar213 = local_2ac * 3.0;
                  fVar226 = ((fVar213 + 2.0) * (fVar211 + fVar211) + fVar211 * -3.0 * fVar211) * 0.5
                  ;
                  fVar212 = (fVar211 * -2.0 * local_2ac + local_2ac * local_2ac) * 0.5;
                  fVar213 = (local_2ac * fVar213 + (fVar213 + -5.0) * (local_2ac + local_2ac)) * 0.5
                  ;
                  fVar211 = (local_2ac * (fVar211 + fVar211) - fVar211 * fVar211) * 0.5;
                  local_2b8 = CONCAT44(fVar211 * fStack_234 +
                                       fVar213 * fStack_244 +
                                       fVar226 * fStack_254 + fVar212 * fStack_264,
                                       fVar211 * local_238 +
                                       fVar213 * local_248 +
                                       fVar226 * local_258 + fVar212 * local_268);
                  local_2b0 = fVar211 * fStack_230 +
                              fVar213 * fStack_240 + fVar226 * fStack_250 + fVar212 * fStack_260;
                  args.context = context->user;
                  local_2a4 = SUB84(local_280,0);
                  local_2a0 = SUB84(local_348,0);
                  local_29c = (args.context)->instID[0];
                  local_298 = (args.context)->instPrimID[0];
                  local_40c = -1;
                  args.valid = &local_40c;
                  args.geometryUserPtr = ((Geometry *)auVar98)->userPtr;
                  args.hit = (RTCHitN *)&local_2b8;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if ((((Geometry *)auVar98)->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*((Geometry *)auVar98)->occlusionFilterN)(&args), pRVar100 = extraout_RDX_01,
                     *args.valid != 0)) {
                    pRVar96 = context->args;
                    auVar98 = (undefined1  [8])pRVar96;
                    if ((pRVar96->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar96->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (auVar98 = local_378,
                         ((ulong)((RTCIntersectArguments *)((long)local_378 + 0x20))->intersect &
                         0x40000000000000) == 0)) ||
                        ((*pRVar96->filter)(&args), pRVar100 = extraout_RDX_02, *args.valid != 0))))
                    {
                      pRVar96 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)auVar98 >> 8),1);
                      pRVar104 = local_348;
                      lVar106 = local_3a0;
                      goto LAB_003c705c;
                    }
                  }
                  ray->tfar = local_368;
                  uVar99 = uVar99 ^ 1L << (uVar97 & 0x3f);
                  uVar97 = 0;
                  if (uVar99 != 0) {
                    for (; (uVar99 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                    }
                  }
                  auVar98 = local_378;
                }
                pRVar96 = (RTCIntersectArguments *)0x0;
                pRVar104 = local_348;
                lVar106 = local_3a0;
              }
LAB_003c705c:
              bVar107 = bVar107 | (byte)pRVar96;
            }
          }
        }
      }
    }
    if (bVar107 != 0) break;
    fVar293 = ray->tfar;
    auVar169._4_4_ = -(uint)(fVar133 <= fVar293);
    auVar169._0_4_ = -(uint)(fVar113 <= fVar293);
    auVar169._8_4_ = -(uint)(fVar136 <= fVar293);
    auVar169._12_4_ = -(uint)(fVar179 <= fVar293);
    uVar108 = movmskps(uVar102,auVar169);
  }
  return uVar103 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }